

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_tree(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  xmlNodePtr pxVar33;
  xmlBufferPtr pxVar34;
  xmlDocPtr pxVar35;
  xmlAttrPtr pxVar36;
  long lVar37;
  size_t sVar38;
  undefined8 uVar39;
  xmlDocPtr pxVar40;
  xmlDocPtr pxVar41;
  ulong uVar42;
  FILE *pFVar43;
  xmlNodePtr pxVar44;
  xmlNodePtr pxVar45;
  xmlChar *pxVar46;
  undefined8 uVar47;
  int nr;
  int nr_00;
  int nr_01;
  int nr_02;
  int nr_03;
  int nr_04;
  int nr_05;
  int nr_06;
  int nr_07;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int nr_08;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int nr_09;
  int extraout_EDX_12;
  int extraout_EDX_13;
  int extraout_EDX_14;
  int extraout_EDX_15;
  int extraout_EDX_16;
  int nr_10;
  int nr_11;
  int nr_12;
  int extraout_EDX_17;
  int extraout_EDX_18;
  int extraout_EDX_19;
  int extraout_EDX_20;
  int nr_13;
  int nr_14;
  int nr_15;
  int nr_16;
  int extraout_EDX_21;
  int extraout_EDX_22;
  int extraout_EDX_23;
  int extraout_EDX_24;
  int extraout_EDX_25;
  int extraout_EDX_26;
  int nr_17;
  int nr_18;
  int nr_19;
  int nr_20;
  int nr_21;
  int nr_22;
  int nr_23;
  int extraout_EDX_27;
  int extraout_EDX_28;
  int extraout_EDX_29;
  int extraout_EDX_30;
  int extraout_EDX_31;
  int extraout_EDX_32;
  int nr_24;
  int nr_25;
  int extraout_EDX_33;
  int extraout_EDX_34;
  int nr_26;
  int nr_27;
  int nr_28;
  int test_ret_8;
  undefined4 *puVar48;
  xmlNs *pxVar49;
  undefined *puVar50;
  int n_parent;
  uint uVar51;
  int iVar52;
  uint uVar53;
  undefined4 uVar54;
  xmlDocPtr in_RSI;
  xmlDocPtr pxVar55;
  char *pcVar56;
  undefined4 uVar57;
  int n_cur;
  uint uVar58;
  ulong *puVar59;
  int n_string;
  uint uVar60;
  uint uVar61;
  int n_options;
  char *pcVar62;
  uint *puVar63;
  char *__s;
  int n_str;
  undefined8 *puVar64;
  int *piVar65;
  bool bVar66;
  undefined1 auVar67 [12];
  int test_ret_1;
  int test_ret;
  int test_ret_4;
  int test_ret_2;
  int test_ret_3;
  int test_ret_33;
  int test_ret_18;
  int test_ret_17;
  int test_ret_16;
  
  if (quiet == '\0') {
    puts("Testing tree : 142 of 164 functions ...");
  }
  uVar51 = 0;
  iVar26 = 0;
  do {
    uVar58 = 0;
    do {
      iVar2 = (int)in_RSI;
      iVar1 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar51,iVar2);
      if (uVar58 == 0) {
        uVar39 = xmlNewPI("test",0);
      }
      else {
        uVar39 = 0;
      }
      pxVar33 = (xmlNodePtr)xmlAddChild(in_RSI,uVar39);
      if (pxVar33 == (xmlNodePtr)0x0) {
        xmlFreeNode(uVar39);
      }
      desret_xmlNodePtr(pxVar33);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar51,(xmlNodePtr)in_RSI,nr);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddChild",(ulong)(uint)(iVar2 - iVar1));
        iVar26 = iVar26 + 1;
        printf(" %d",(ulong)uVar51);
        in_RSI = (xmlDocPtr)(ulong)uVar58;
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
    } while (uVar58 != 3);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar2 = 0;
  iVar1 = 0;
  do {
    uVar51 = 0;
    do {
      iVar4 = (int)in_RSI;
      iVar3 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar2,iVar4);
      if (uVar51 == 0) {
        uVar39 = xmlNewPI("test",0);
      }
      else {
        uVar39 = 0;
      }
      pxVar33 = (xmlNodePtr)xmlAddChildList(in_RSI,uVar39);
      if (pxVar33 == (xmlNodePtr)0x0) {
        xmlFreeNodeList(uVar39);
      }
      desret_xmlNodePtr(pxVar33);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar2,(xmlNodePtr)in_RSI,nr_00);
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddChildList",(ulong)(uint)(iVar4 - iVar3));
        iVar1 = iVar1 + 1;
        printf(" %d",iVar2);
        in_RSI = (xmlDocPtr)(ulong)uVar51;
        printf(" %d");
        putchar(10);
      }
      uVar51 = uVar51 + 1;
    } while (uVar51 != 3);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 3);
  function_tests = function_tests + 1;
  uVar51 = 0;
  iVar2 = 0;
  do {
    uVar58 = 0;
    do {
      iVar4 = (int)in_RSI;
      iVar3 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar51,iVar4);
      if (uVar58 == 0) {
        uVar39 = xmlNewPI("test",0);
      }
      else {
        uVar39 = 0;
      }
      pxVar33 = (xmlNodePtr)xmlAddNextSibling(in_RSI,uVar39);
      if (pxVar33 == (xmlNodePtr)0x0) {
        xmlFreeNode(uVar39);
      }
      desret_xmlNodePtr(pxVar33);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar51,(xmlNodePtr)in_RSI,nr_01);
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddNextSibling",(ulong)(uint)(iVar4 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar51);
        in_RSI = (xmlDocPtr)(ulong)uVar58;
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
    } while (uVar58 != 3);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  uVar51 = 0;
  iVar3 = 0;
  do {
    uVar58 = 0;
    do {
      iVar5 = (int)in_RSI;
      iVar4 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar51,iVar5);
      if (uVar58 == 0) {
        uVar39 = xmlNewPI("test",0);
      }
      else {
        uVar39 = 0;
      }
      pxVar33 = (xmlNodePtr)xmlAddPrevSibling(in_RSI,uVar39);
      if (pxVar33 == (xmlNodePtr)0x0) {
        xmlFreeNode(uVar39);
      }
      desret_xmlNodePtr(pxVar33);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar51,(xmlNodePtr)in_RSI,nr_02);
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddPrevSibling",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar51);
        in_RSI = (xmlDocPtr)(ulong)uVar58;
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
    } while (uVar58 != 3);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  uVar51 = 0;
  iVar4 = 0;
  do {
    uVar58 = 0;
    do {
      iVar6 = (int)in_RSI;
      iVar5 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar51,iVar6);
      if (uVar58 == 0) {
        uVar39 = xmlNewPI("test",0);
      }
      else {
        uVar39 = 0;
      }
      pxVar33 = (xmlNodePtr)xmlAddSibling(in_RSI,uVar39);
      if (pxVar33 == (xmlNodePtr)0x0) {
        xmlFreeNode(uVar39);
      }
      desret_xmlNodePtr(pxVar33);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar51,(xmlNodePtr)in_RSI,nr_03);
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddSibling",(ulong)(uint)(iVar6 - iVar5));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar51);
        in_RSI = (xmlDocPtr)(ulong)uVar58;
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
    } while (uVar58 != 3);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      uVar61 = 0;
      do {
        puVar64 = &DAT_00162d68;
        pxVar55 = (xmlDocPtr)0x0;
        do {
          iVar7 = (int)in_RSI;
          iVar6 = xmlMemBlocks();
          pxVar34 = gen_xmlBufferPtr(uVar51,iVar7);
          pxVar35 = gen_xmlDocPtr(uVar58,iVar7);
          pxVar36 = gen_xmlAttrPtr(uVar61,iVar7);
          uVar60 = (uint)pxVar55;
          if (uVar60 < 4) {
            uVar39 = *puVar64;
          }
          else {
            uVar39 = 0;
          }
          in_RSI = pxVar35;
          xmlAttrSerializeTxtContent(pxVar34,pxVar35,pxVar36,uVar39);
          call_tests = call_tests + 1;
          if (pxVar34 != (xmlBufferPtr)0x0) {
            xmlBufferFree(pxVar34);
          }
          if (((pxVar35 != (xmlDocPtr)0x0) && (api_doc != pxVar35)) && (pxVar35->doc != api_doc)) {
            xmlFreeDoc(pxVar35);
          }
          if (uVar61 == 0) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar6 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlAttrSerializeTxtContent",
                   (ulong)(uint)(iVar7 - iVar6));
            iVar5 = iVar5 + 1;
            printf(" %d",(ulong)uVar51);
            printf(" %d",(ulong)uVar58);
            printf(" %d",(ulong)uVar61);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar55;
          }
          uVar60 = uVar60 + 1;
          pxVar55 = (xmlDocPtr)(ulong)uVar60;
          puVar64 = puVar64 + 1;
        } while (uVar60 != 5);
        bVar66 = uVar61 == 0;
        uVar61 = uVar61 + 1;
      } while (bVar66);
      uVar58 = uVar58 + 1;
    } while (uVar58 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar6 = xmlMemBlocks();
  lVar37 = xmlBufContent(0);
  if (lVar37 != 0) {
    (*_xmlFree)(lVar37);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar7 = xmlMemBlocks();
  if (iVar6 != iVar7) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlBufContent");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar8 = xmlMemBlocks();
  lVar37 = xmlBufEnd(0);
  if (lVar37 != 0) {
    (*_xmlFree)(lVar37);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar9 = xmlMemBlocks();
  if (iVar8 != iVar9) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlBufEnd");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar10 = xmlMemBlocks();
  pxVar55 = (xmlDocPtr)0x0;
  xmlBufGetNodeContent(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar11 = xmlMemBlocks();
  if (iVar10 != iVar11) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlBufGetNodeContent");
    printf(" %d");
    pxVar55 = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar27 = 0;
  uVar51 = 0;
  do {
    iVar52 = 0;
    do {
      piVar65 = &DAT_0015fd28;
      uVar58 = 0;
      do {
        iVar12 = xmlMemBlocks();
        pxVar34 = gen_xmlBufferPtr(uVar51,(int)pxVar55);
        switch(iVar52) {
        case 0:
          bVar66 = false;
          pcVar62 = "foo";
          break;
        case 1:
          bVar66 = false;
          pcVar62 = "<foo/>";
          break;
        case 2:
          bVar66 = false;
          pcVar62 = anon_var_dwarf_1b8;
          break;
        case 3:
          bVar66 = false;
          pcVar62 = " 2ab ";
          break;
        default:
          bVar66 = true;
          pcVar62 = (char *)0x0;
        }
        iVar13 = -1;
        if (uVar58 < 4) {
          iVar13 = *piVar65;
        }
        if ((bVar66) || (sVar38 = strlen(pcVar62), iVar13 <= (int)sVar38 + 1)) {
          xmlBufferAdd(pxVar34,pcVar62,iVar13);
          call_tests = call_tests + 1;
          pxVar55 = (xmlDocPtr)pcVar62;
          if (pxVar34 != (xmlBufferPtr)0x0) {
            xmlBufferFree(pxVar34);
            pxVar55 = (xmlDocPtr)pcVar62;
          }
          xmlResetLastError();
          iVar13 = xmlMemBlocks();
          if (iVar12 != iVar13) {
            iVar13 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlBufferAdd",(ulong)(uint)(iVar13 - iVar12));
            iVar27 = iVar27 + 1;
            printf(" %d",(ulong)uVar51);
            printf(" %d",iVar52);
            pxVar55 = (xmlDocPtr)(ulong)uVar58;
            printf(" %d");
            putchar(10);
          }
        }
        uVar58 = uVar58 + 1;
        piVar65 = piVar65 + 1;
      } while (uVar58 != 4);
      iVar52 = iVar52 + 1;
    } while (iVar52 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar52 = 0;
  uVar51 = 0;
  do {
    iVar12 = 0;
    do {
      uVar58 = 0;
      piVar65 = &DAT_0015fd28;
      do {
        iVar13 = xmlMemBlocks();
        pxVar34 = gen_xmlBufferPtr(uVar51,(int)pxVar55);
        switch(iVar12) {
        case 0:
          bVar66 = false;
          pcVar62 = "foo";
          break;
        case 1:
          bVar66 = false;
          pcVar62 = "<foo/>";
          break;
        case 2:
          bVar66 = false;
          pcVar62 = anon_var_dwarf_1b8;
          break;
        case 3:
          bVar66 = false;
          pcVar62 = " 2ab ";
          break;
        default:
          bVar66 = true;
          pcVar62 = (char *)0x0;
        }
        iVar14 = -1;
        if (uVar58 < 4) {
          iVar14 = *piVar65;
        }
        if ((bVar66) || (sVar38 = strlen(pcVar62), iVar14 <= (int)sVar38 + 1)) {
          xmlBufferAddHead(pxVar34,pcVar62,iVar14);
          call_tests = call_tests + 1;
          pxVar55 = (xmlDocPtr)pcVar62;
          if (pxVar34 != (xmlBufferPtr)0x0) {
            xmlBufferFree(pxVar34);
            pxVar55 = (xmlDocPtr)pcVar62;
          }
          xmlResetLastError();
          iVar14 = xmlMemBlocks();
          if (iVar13 != iVar14) {
            iVar14 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlBufferAddHead",(ulong)(uint)(iVar14 - iVar13));
            iVar52 = iVar52 + 1;
            printf(" %d",(ulong)uVar51);
            printf(" %d",iVar12);
            pxVar55 = (xmlDocPtr)(ulong)uVar58;
            printf(" %d");
            putchar(10);
          }
        }
        uVar58 = uVar58 + 1;
        piVar65 = piVar65 + 1;
      } while (uVar58 != 4);
      iVar12 = iVar12 + 1;
    } while (iVar12 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar12 = 0;
  uVar51 = 0;
  do {
    puVar64 = &DAT_00162d50;
    pxVar35 = (xmlDocPtr)0x0;
    do {
      iVar14 = (int)pxVar55;
      iVar13 = xmlMemBlocks();
      pxVar34 = gen_xmlBufferPtr(uVar51,iVar14);
      uVar58 = (uint)pxVar35;
      if (uVar58 < 3) {
        pxVar55 = (xmlDocPtr)*puVar64;
      }
      else {
        pxVar55 = (xmlDocPtr)0x0;
      }
      xmlBufferCCat(pxVar34);
      call_tests = call_tests + 1;
      if (pxVar34 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar34);
      }
      xmlResetLastError();
      iVar14 = xmlMemBlocks();
      if (iVar13 != iVar14) {
        iVar14 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferCCat",(ulong)(uint)(iVar14 - iVar13));
        iVar12 = iVar12 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d");
        putchar(10);
        pxVar55 = pxVar35;
      }
      uVar58 = uVar58 + 1;
      pxVar35 = (xmlDocPtr)(ulong)uVar58;
      puVar64 = puVar64 + 1;
    } while (uVar58 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar13 = 0;
  uVar51 = 0;
  do {
    puVar64 = &DAT_00162d68;
    pxVar35 = (xmlDocPtr)0x0;
    do {
      iVar15 = (int)pxVar55;
      iVar14 = xmlMemBlocks();
      pxVar34 = gen_xmlBufferPtr(uVar51,iVar15);
      uVar58 = (uint)pxVar35;
      if (uVar58 < 4) {
        pxVar55 = (xmlDocPtr)*puVar64;
      }
      else {
        pxVar55 = (xmlDocPtr)0x0;
      }
      xmlBufferCat(pxVar34);
      call_tests = call_tests + 1;
      if (pxVar34 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar34);
      }
      xmlResetLastError();
      iVar15 = xmlMemBlocks();
      if (iVar14 != iVar15) {
        iVar15 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferCat",(ulong)(uint)(iVar15 - iVar14));
        iVar13 = iVar13 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d");
        putchar(10);
        pxVar55 = pxVar35;
      }
      uVar58 = uVar58 + 1;
      pxVar35 = (xmlDocPtr)(ulong)uVar58;
      puVar64 = puVar64 + 1;
    } while (uVar58 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar14 = xmlMemBlocks();
  xmlBufferContent(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar15 = xmlMemBlocks();
  if (iVar14 != iVar15) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlBufferContent");
    pxVar55 = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar16 = xmlMemBlocks();
  uVar39 = xmlBufferCreate();
  xmlBufferFree(uVar39);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar17 = xmlMemBlocks();
  if (iVar16 != iVar17) {
    iVar18 = xmlMemBlocks();
    pxVar55 = (xmlDocPtr)(ulong)(uint)(iVar18 - iVar16);
    printf("Leak of %d blocks found in xmlBufferCreate");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar51 = 0;
  iVar18 = 0;
  do {
    iVar19 = xmlMemBlocks();
    pxVar34 = gen_xmlBufferPtr(uVar51,(int)pxVar55);
    lVar37 = xmlBufferDetach(pxVar34);
    if (lVar37 != 0) {
      (*_xmlFree)(lVar37);
    }
    call_tests = call_tests + 1;
    if (pxVar34 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar34);
    }
    xmlResetLastError();
    iVar20 = xmlMemBlocks();
    if (iVar19 != iVar20) {
      iVar20 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlBufferDetach",(ulong)(uint)(iVar20 - iVar19));
      iVar18 = iVar18 + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  uVar51 = 0;
  test_ret = 0;
  do {
    iVar19 = xmlMemBlocks();
    pxVar34 = gen_xmlBufferPtr(uVar51,(int)pxVar55);
    xmlBufferEmpty(pxVar34);
    call_tests = call_tests + 1;
    if (pxVar34 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar34);
    }
    xmlResetLastError();
    iVar20 = xmlMemBlocks();
    if (iVar19 != iVar20) {
      iVar20 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlBufferEmpty",(ulong)(uint)(iVar20 - iVar19));
      test_ret = test_ret + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  test_ret_4 = (int)(iVar16 != iVar17);
  function_tests = function_tests + 1;
  iVar16 = 0;
  uVar51 = 0;
  do {
    puVar63 = &DAT_001521ec;
    pxVar35 = (xmlDocPtr)0x0;
    do {
      iVar19 = (int)pxVar55;
      iVar17 = xmlMemBlocks();
      pxVar34 = gen_xmlBufferPtr(uVar51,iVar19);
      pxVar55 = (xmlDocPtr)0xffffffff;
      uVar58 = (uint)pxVar35;
      if (uVar58 < 3) {
        pxVar55 = (xmlDocPtr)(ulong)*puVar63;
      }
      xmlBufferGrow(pxVar34);
      call_tests = call_tests + 1;
      if (pxVar34 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar34);
      }
      xmlResetLastError();
      iVar19 = xmlMemBlocks();
      if (iVar17 != iVar19) {
        iVar19 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferGrow",(ulong)(uint)(iVar19 - iVar17));
        iVar16 = iVar16 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d");
        putchar(10);
        pxVar55 = pxVar35;
      }
      uVar58 = uVar58 + 1;
      pxVar35 = (xmlDocPtr)(ulong)uVar58;
      puVar63 = puVar63 + 1;
    } while (uVar58 != 3);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar16 = test_ret + iVar16;
  iVar17 = xmlMemBlocks();
  xmlBufferLength(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar19 = xmlMemBlocks();
  if (iVar17 != iVar19) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlBufferLength");
    pxVar55 = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar20 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    puVar63 = &DAT_001521ec;
    do {
      iVar22 = (int)pxVar55;
      iVar21 = xmlMemBlocks();
      pxVar34 = gen_xmlBufferPtr(uVar51,iVar22);
      pxVar55 = (xmlDocPtr)0xffffffff;
      if (uVar58 < 3) {
        pxVar55 = (xmlDocPtr)(ulong)*puVar63;
      }
      xmlBufferResize(pxVar34);
      call_tests = call_tests + 1;
      if (pxVar34 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar34);
      }
      xmlResetLastError();
      iVar22 = xmlMemBlocks();
      if (iVar21 != iVar22) {
        iVar22 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferResize",(ulong)(uint)(iVar22 - iVar21));
        iVar20 = iVar20 + 1;
        printf(" %d",(ulong)uVar51);
        pxVar55 = (xmlDocPtr)(ulong)uVar58;
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
      puVar63 = puVar63 + 1;
    } while (uVar58 != 3);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar21 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0xffffffff;
    do {
      iVar23 = (int)pxVar55;
      iVar22 = xmlMemBlocks();
      pxVar34 = gen_xmlBufferPtr(uVar51,iVar23);
      pxVar55 = (xmlDocPtr)0x0;
      if (uVar58 < 3) {
        pxVar55 = (xmlDocPtr)(ulong)(uint)(&DAT_001521f8)[uVar58];
      }
      xmlBufferSetAllocationScheme(pxVar34);
      call_tests = call_tests + 1;
      if (pxVar34 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar34);
      }
      uVar58 = uVar58 + 1;
      xmlResetLastError();
      iVar23 = xmlMemBlocks();
      if (iVar22 != iVar23) {
        iVar23 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferSetAllocationScheme",
               (ulong)(uint)(iVar23 - iVar22));
        iVar21 = iVar21 + 1;
        printf(" %d",(ulong)uVar51);
        pxVar55 = (xmlDocPtr)(ulong)uVar58;
        printf(" %d");
        putchar(10);
      }
    } while (uVar58 != 3);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  test_ret = 0;
  uVar51 = 0;
  do {
    puVar63 = &DAT_001521ec;
    uVar58 = 0;
    do {
      iVar23 = (int)pxVar55;
      iVar22 = xmlMemBlocks();
      pxVar34 = gen_xmlBufferPtr(uVar51,iVar23);
      pxVar55 = (xmlDocPtr)0xffffffff;
      if (uVar58 < 3) {
        pxVar55 = (xmlDocPtr)(ulong)*puVar63;
      }
      xmlBufferShrink(pxVar34);
      call_tests = call_tests + 1;
      if (pxVar34 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar34);
      }
      xmlResetLastError();
      iVar23 = xmlMemBlocks();
      if (iVar22 != iVar23) {
        iVar23 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferShrink",(ulong)(uint)(iVar23 - iVar22));
        test_ret = test_ret + 1;
        printf(" %d",(ulong)uVar51);
        pxVar55 = (xmlDocPtr)(ulong)uVar58;
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
      puVar63 = puVar63 + 1;
    } while (uVar58 != 3);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar22 = 0;
  uVar51 = 0;
  do {
    puVar64 = &DAT_00162d68;
    uVar58 = 0;
    do {
      iVar24 = (int)pxVar55;
      iVar23 = xmlMemBlocks();
      pxVar34 = gen_xmlBufferPtr(uVar51,iVar24);
      if (uVar58 < 4) {
        pxVar55 = (xmlDocPtr)*puVar64;
      }
      else {
        pxVar55 = (xmlDocPtr)0x0;
      }
      xmlBufferWriteCHAR(pxVar34);
      call_tests = call_tests + 1;
      if (pxVar34 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar34);
      }
      xmlResetLastError();
      iVar24 = xmlMemBlocks();
      if (iVar23 != iVar24) {
        iVar24 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferWriteCHAR",(ulong)(uint)(iVar24 - iVar23));
        iVar22 = iVar22 + 1;
        printf(" %d",(ulong)uVar51);
        pxVar55 = (xmlDocPtr)(ulong)uVar58;
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
      puVar64 = puVar64 + 1;
    } while (uVar58 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar23 = 0;
  uVar51 = 0;
  do {
    puVar64 = &DAT_00162d50;
    uVar58 = 0;
    do {
      iVar25 = (int)pxVar55;
      iVar24 = xmlMemBlocks();
      pxVar34 = gen_xmlBufferPtr(uVar51,iVar25);
      if (uVar58 < 3) {
        pxVar55 = (xmlDocPtr)*puVar64;
      }
      else {
        pxVar55 = (xmlDocPtr)0x0;
      }
      xmlBufferWriteChar(pxVar34);
      call_tests = call_tests + 1;
      if (pxVar34 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar34);
      }
      xmlResetLastError();
      iVar25 = xmlMemBlocks();
      if (iVar24 != iVar25) {
        iVar25 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferWriteChar",(ulong)(uint)(iVar25 - iVar24));
        iVar23 = iVar23 + 1;
        printf(" %d",(ulong)uVar51);
        pxVar55 = (xmlDocPtr)(ulong)uVar58;
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
      puVar64 = puVar64 + 1;
    } while (uVar58 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  iVar26 = iVar1 + iVar26 + iVar2 + iVar3 + iVar4 + iVar5 + (uint)(iVar6 != iVar7) +
           (uint)(iVar8 != iVar9) + (uint)(iVar10 != iVar11) + iVar27 + iVar52 + iVar12 + iVar13 +
           (uint)(iVar14 != iVar15) + test_ret_4 + iVar18 + iVar16 + (uint)(iVar17 != iVar19) +
           iVar20 + iVar21 + test_ret;
  function_tests = function_tests + 1;
  test_ret_17 = 0;
  uVar51 = 0;
  do {
    puVar64 = &DAT_00162d68;
    uVar58 = 0;
    do {
      iVar2 = (int)pxVar55;
      iVar1 = xmlMemBlocks();
      pxVar34 = gen_xmlBufferPtr(uVar51,iVar2);
      if (uVar58 < 4) {
        pxVar55 = (xmlDocPtr)*puVar64;
      }
      else {
        pxVar55 = (xmlDocPtr)0x0;
      }
      xmlBufferWriteQuotedString(pxVar34);
      call_tests = call_tests + 1;
      if (pxVar34 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar34);
      }
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferWriteQuotedString",(ulong)(uint)(iVar2 - iVar1))
        ;
        test_ret_17 = test_ret_17 + 1;
        printf(" %d",(ulong)uVar51);
        pxVar55 = (xmlDocPtr)(ulong)uVar58;
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
      puVar64 = puVar64 + 1;
    } while (uVar58 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  test_ret_18 = 0;
  uVar51 = 0;
  do {
    iVar1 = 0;
    do {
      uVar42 = 0;
      do {
        iVar2 = (int)uVar42;
        pxVar46 = (xmlChar *)0x0;
        if (iVar2 == 0) {
          pxVar46 = chartab;
        }
        piVar65 = &DAT_0015fd28;
        pxVar35 = (xmlDocPtr)0x0;
        do {
          iVar3 = xmlMemBlocks();
          if (uVar51 < 4) {
            _test_ret_1 = (xmlDocPtr)(&DAT_00162d68)[uVar51];
          }
          else {
            _test_ret_1 = (xmlDocPtr)0x0;
          }
          switch(iVar1) {
          case 0:
            bVar66 = false;
            pcVar62 = "foo";
            break;
          case 1:
            bVar66 = false;
            pcVar62 = "<foo/>";
            break;
          case 2:
            bVar66 = false;
            pcVar62 = anon_var_dwarf_1b8;
            break;
          case 3:
            bVar66 = false;
            pcVar62 = " 2ab ";
            break;
          default:
            bVar66 = true;
            pcVar62 = (char *)0x0;
          }
          iVar4 = -1;
          uVar58 = (uint)pxVar35;
          if (uVar58 < 4) {
            iVar4 = *piVar65;
          }
          if ((bVar66) || (sVar38 = strlen(pcVar62), iVar4 <= (int)sVar38 + 1)) {
            pxVar55 = (xmlDocPtr)pcVar62;
            pxVar40 = (xmlDocPtr)xmlBuildQName(_test_ret_1,pcVar62,pxVar46,iVar4);
            if ((pxVar40 != (xmlDocPtr)pxVar46) &&
               (((pxVar40 != (xmlDocPtr)pcVar62 && (pxVar40 != (xmlDocPtr)0x0)) &&
                (pxVar40 != _test_ret_1)))) {
              (*_xmlFree)(pxVar40);
            }
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar4 = xmlMemBlocks();
            if (iVar3 != iVar4) {
              iVar4 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlBuildQName",(ulong)(uint)(iVar4 - iVar3));
              test_ret_18 = test_ret_18 + 1;
              printf(" %d",(ulong)uVar51);
              printf(" %d",iVar1);
              printf(" %d",uVar42);
              printf(" %d");
              putchar(10);
              pxVar55 = pxVar35;
            }
          }
          uVar58 = uVar58 + 1;
          pxVar35 = (xmlDocPtr)(ulong)uVar58;
          piVar65 = piVar65 + 1;
        } while (uVar58 != 4);
        uVar42 = (ulong)(iVar2 + 1);
      } while (iVar2 == 0);
      iVar1 = iVar1 + 1;
    } while (iVar1 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  uVar51 = 0;
  test_ret = 0;
  do {
    iVar2 = (int)pxVar55;
    iVar1 = xmlMemBlocks();
    pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar51,iVar2);
    xmlChildElementCount(pxVar55);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar51,(xmlNodePtr)pxVar55,nr_04);
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlChildElementCount",(ulong)(uint)(iVar2 - iVar1));
      test_ret = test_ret + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar1 = 0;
  uVar51 = 0;
  do {
    puVar63 = &DAT_0015fd28;
    pxVar35 = (xmlDocPtr)0x0;
    do {
      iVar3 = (int)pxVar55;
      iVar2 = xmlMemBlocks();
      pxVar40 = gen_xmlDocPtr(uVar51,iVar3);
      pxVar55 = (xmlDocPtr)0xffffffff;
      uVar58 = (uint)pxVar35;
      if (uVar58 < 4) {
        pxVar55 = (xmlDocPtr)(ulong)*puVar63;
      }
      pxVar41 = (xmlDocPtr)xmlCopyDoc(pxVar40);
      if (api_doc != pxVar41) {
        xmlFreeDoc(pxVar41);
      }
      call_tests = call_tests + 1;
      if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
        xmlFreeDoc(pxVar40);
      }
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyDoc",(ulong)(uint)(iVar3 - iVar2));
        iVar1 = iVar1 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d");
        putchar(10);
        pxVar55 = pxVar35;
      }
      uVar58 = uVar58 + 1;
      pxVar35 = (xmlDocPtr)(ulong)uVar58;
      puVar63 = puVar63 + 1;
    } while (uVar58 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  uVar51 = 0;
  iVar2 = 0;
  do {
    iVar4 = (int)pxVar55;
    iVar3 = xmlMemBlocks();
    pxVar55 = (xmlDocPtr)gen_xmlDtdPtr(uVar51,iVar4);
    pxVar33 = (xmlNodePtr)xmlCopyDtd(pxVar55);
    desret_xmlNodePtr(pxVar33);
    call_tests = call_tests + 1;
    des_xmlDtdPtr(uVar51,(xmlDtdPtr)pxVar55,nr_05);
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCopyDtd",(ulong)(uint)(iVar4 - iVar3));
      iVar2 = iVar2 + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  iVar26 = iVar26 + iVar22 + iVar23 + test_ret_17 + test_ret_18 + test_ret;
  function_tests = function_tests + 1;
  uVar51 = 0;
  test_ret = 0;
  do {
    iVar3 = xmlMemBlocks();
    if (uVar51 == 0) {
      get_api_root();
      pxVar49 = api_ns;
      if (api_root != (xmlNodePtr)0x0) {
        pxVar49 = api_root->nsDef;
        api_ns = pxVar49;
      }
    }
    else {
      pxVar49 = (xmlNs *)0x0;
    }
    lVar37 = xmlCopyNamespace(pxVar49);
    if (lVar37 != 0) {
      xmlFreeNs();
    }
    call_tests = call_tests + 1;
    if (uVar51 == 0) {
      xmlFreeDoc();
      api_doc = (xmlDocPtr)0x0;
      api_dtd = (xmlDtdPtr)0x0;
      api_root = (xmlNodePtr)0x0;
      api_ns = (xmlNsPtr)0x0;
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCopyNamespace",(ulong)(uint)(iVar4 - iVar3));
      test_ret = test_ret + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
  } while (uVar51 == 1);
  function_tests = function_tests + 1;
  uVar51 = 0;
  iVar3 = 0;
  do {
    iVar4 = xmlMemBlocks();
    if (uVar51 == 0) {
      get_api_root();
      pxVar49 = api_ns;
      if (api_root != (xmlNodePtr)0x0) {
        pxVar49 = api_root->nsDef;
        api_ns = pxVar49;
      }
    }
    else {
      pxVar49 = (xmlNs *)0x0;
    }
    lVar37 = xmlCopyNamespaceList(pxVar49);
    if (lVar37 != 0) {
      xmlFreeNsList();
    }
    call_tests = call_tests + 1;
    if (uVar51 == 0) {
      xmlFreeDoc();
      api_doc = (xmlDocPtr)0x0;
      api_dtd = (xmlDtdPtr)0x0;
      api_root = (xmlNodePtr)0x0;
      api_ns = (xmlNsPtr)0x0;
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCopyNamespaceList",(ulong)(uint)(iVar5 - iVar4));
      iVar3 = iVar3 + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
  } while (uVar51 == 1);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar51 = 0;
  do {
    puVar48 = &DAT_0015fd28;
    pxVar35 = (xmlDocPtr)0x0;
    do {
      iVar6 = (int)pxVar55;
      iVar5 = xmlMemBlocks();
      pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar51,iVar6);
      uVar54 = 0xffffffff;
      uVar58 = (uint)pxVar35;
      if (uVar58 < 4) {
        uVar54 = *puVar48;
      }
      pxVar33 = (xmlNodePtr)xmlCopyNode(pxVar55,uVar54);
      desret_xmlNodePtr(pxVar33);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar51,(xmlNodePtr)pxVar55,nr_06);
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyNode",(ulong)(uint)(iVar6 - iVar5));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d");
        putchar(10);
        pxVar55 = pxVar35;
      }
      uVar58 = uVar58 + 1;
      pxVar35 = (xmlDocPtr)(ulong)uVar58;
      puVar48 = puVar48 + 1;
    } while (uVar58 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  iVar26 = iVar26 + iVar1 + iVar2 + test_ret;
  function_tests = function_tests + 1;
  uVar51 = 0;
  iVar1 = 0;
  do {
    iVar5 = (int)pxVar55;
    iVar2 = xmlMemBlocks();
    pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar51,iVar5);
    pxVar33 = (xmlNodePtr)xmlCopyNodeList(pxVar55);
    desret_xmlNodePtr(pxVar33);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar51,(xmlNodePtr)pxVar55,nr_07);
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar2 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCopyNodeList",(ulong)(uint)(iVar5 - iVar2));
      iVar1 = iVar1 + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  test_ret = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      iVar2 = (int)pxVar55;
      iVar5 = xmlMemBlocks();
      pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar51,iVar2);
      pxVar36 = gen_xmlAttrPtr(uVar58,iVar2);
      auVar67 = xmlCopyProp(pxVar55,pxVar36);
      iVar2 = auVar67._8_4_;
      lVar37 = auVar67._0_8_;
      if (lVar37 != 0) {
        xmlUnlinkNode(lVar37);
        xmlFreeNode(lVar37);
        iVar2 = extraout_EDX;
      }
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar51,(xmlNodePtr)pxVar55,iVar2);
      if (uVar58 == 0) {
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar5 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyProp",(ulong)(uint)(iVar2 - iVar5));
        test_ret = test_ret + 1;
        printf(" %d",(ulong)uVar51);
        pxVar55 = (xmlDocPtr)(ulong)uVar58;
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
    } while (uVar58 == 1);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  test_ret_18 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      iVar2 = (int)pxVar55;
      iVar5 = xmlMemBlocks();
      pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar51,iVar2);
      pxVar36 = gen_xmlAttrPtr(uVar58,iVar2);
      auVar67 = xmlCopyPropList(pxVar55,pxVar36);
      iVar2 = auVar67._8_4_;
      lVar37 = auVar67._0_8_;
      if (lVar37 != 0) {
        xmlUnlinkNode(lVar37);
        xmlFreeNode(lVar37);
        iVar2 = extraout_EDX_00;
      }
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar51,(xmlNodePtr)pxVar55,iVar2);
      if (uVar58 == 0) {
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar5 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyPropList",(ulong)(uint)(iVar2 - iVar5));
        test_ret_18 = test_ret_18 + 1;
        printf(" %d",(ulong)uVar51);
        pxVar55 = (xmlDocPtr)(ulong)uVar58;
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
    } while (uVar58 == 1);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  test_ret_17 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      uVar42 = 0;
      do {
        puVar64 = &DAT_00162d68;
        pxVar35 = (xmlDocPtr)0x0;
        do {
          iVar5 = (int)pxVar55;
          iVar2 = xmlMemBlocks();
          pxVar40 = gen_xmlDocPtr(uVar51,iVar5);
          if (uVar58 < 4) {
            pxVar55 = (xmlDocPtr)(&DAT_00162d68)[uVar58];
          }
          else {
            pxVar55 = (xmlDocPtr)0x0;
          }
          if ((uint)uVar42 < 4) {
            uVar39 = (&DAT_00162d68)[uVar42];
          }
          else {
            uVar39 = 0;
          }
          uVar61 = (uint)pxVar35;
          if (uVar61 < 4) {
            uVar47 = *puVar64;
          }
          else {
            uVar47 = 0;
          }
          pxVar33 = (xmlNodePtr)xmlCreateIntSubset(pxVar40,pxVar55,uVar39,uVar47);
          desret_xmlNodePtr(pxVar33);
          call_tests = call_tests + 1;
          if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
            xmlFreeDoc(pxVar40);
          }
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar2 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlCreateIntSubset",(ulong)(uint)(iVar5 - iVar2));
            test_ret_17 = test_ret_17 + 1;
            printf(" %d",(ulong)uVar51);
            printf(" %d",(ulong)uVar58);
            printf(" %d",uVar42);
            printf(" %d");
            putchar(10);
            pxVar55 = pxVar35;
          }
          uVar61 = uVar61 + 1;
          pxVar35 = (xmlDocPtr)(ulong)uVar61;
          puVar64 = puVar64 + 1;
        } while (uVar61 != 5);
        uVar61 = (uint)uVar42 + 1;
        uVar42 = (ulong)uVar61;
      } while (uVar61 != 5);
      uVar58 = uVar58 + 1;
    } while (uVar58 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar51 = 0;
  do {
    iVar5 = 0;
    do {
      uVar58 = 0;
      do {
        iVar6 = 0;
        do {
          pxVar35 = (xmlDocPtr)0x0;
          puVar48 = &DAT_0015fd28;
          do {
            iVar8 = (int)pxVar55;
            iVar7 = xmlMemBlocks();
            pxVar40 = gen_xmlDocPtr(uVar51,iVar8);
            pxVar33 = gen_xmlNodePtr(iVar5,iVar8);
            pxVar41 = gen_xmlDocPtr(uVar58,iVar8);
            pxVar55 = (xmlDocPtr)gen_xmlNodePtr(iVar6,iVar8);
            uVar54 = 0xffffffff;
            uVar61 = (uint)pxVar35;
            if (uVar61 < 4) {
              uVar54 = *puVar48;
            }
            xmlDOMWrapAdoptNode(0,pxVar40,pxVar33,pxVar41,pxVar55,uVar54);
            pxVar44 = (xmlNodePtr)0x0;
            iVar8 = extraout_EDX_01;
            if ((pxVar33 != (xmlNodePtr)0x0) &&
               (pxVar44 = pxVar33, pxVar33->parent == (_xmlNode *)0x0)) {
              xmlUnlinkNode(pxVar33);
              xmlFreeNode(pxVar33);
              pxVar44 = (xmlNodePtr)0x0;
              iVar8 = extraout_EDX_02;
            }
            call_tests = call_tests + 1;
            if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc))
            {
              xmlFreeDoc(pxVar40);
              iVar8 = extraout_EDX_03;
            }
            des_xmlNodePtr(iVar5,pxVar44,iVar8);
            iVar8 = extraout_EDX_04;
            if (((pxVar41 != (xmlDocPtr)0x0) && (api_doc != pxVar41)) && (pxVar41->doc != api_doc))
            {
              xmlFreeDoc(pxVar41);
              iVar8 = extraout_EDX_05;
            }
            des_xmlNodePtr(iVar6,(xmlNodePtr)pxVar55,iVar8);
            xmlResetLastError();
            iVar8 = xmlMemBlocks();
            if (iVar7 != iVar8) {
              iVar8 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlDOMWrapAdoptNode",(ulong)(uint)(iVar8 - iVar7));
              iVar2 = iVar2 + 1;
              printf(" %d",0);
              printf(" %d",(ulong)uVar51);
              printf(" %d",iVar5);
              printf(" %d",(ulong)uVar58);
              printf(" %d",iVar6);
              printf(" %d");
              putchar(10);
              pxVar55 = pxVar35;
            }
            uVar61 = uVar61 + 1;
            pxVar35 = (xmlDocPtr)(ulong)uVar61;
            puVar48 = puVar48 + 1;
          } while (uVar61 != 4);
          iVar6 = iVar6 + 1;
        } while (iVar6 != 3);
        uVar58 = uVar58 + 1;
      } while (uVar58 != 4);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 3);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  iVar26 = iVar26 + iVar3 + iVar4 + iVar1 + test_ret + test_ret_18;
  function_tests = function_tests + 1;
  test_ret_18 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      uVar61 = 0;
      do {
        iVar1 = 0;
        do {
          uVar60 = 0;
          do {
            puVar48 = &DAT_0015fd28;
            pxVar35 = (xmlDocPtr)0x0;
            do {
              iVar4 = (int)pxVar55;
              iVar3 = xmlMemBlocks();
              pxVar40 = gen_xmlDocPtr(uVar51,iVar4);
              pxVar33 = gen_xmlNodePtr(uVar58,iVar4);
              pxVar41 = gen_xmlDocPtr(uVar61,iVar4);
              pxVar55 = (xmlDocPtr)gen_xmlNodePtr(iVar1,iVar4);
              uVar57 = 0xffffffff;
              uVar54 = 0xffffffff;
              if (uVar60 < 4) {
                uVar54 = (&DAT_0015fd28)[uVar60];
              }
              uVar53 = (uint)pxVar35;
              if (uVar53 < 4) {
                uVar57 = *puVar48;
              }
              xmlDOMWrapCloneNode(0,pxVar40,pxVar33,0,pxVar41,pxVar55,uVar54,uVar57);
              call_tests = call_tests + 1;
              iVar4 = extraout_EDX_06;
              if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar40);
                iVar4 = extraout_EDX_07;
              }
              des_xmlNodePtr(uVar58,pxVar33,iVar4);
              iVar4 = extraout_EDX_08;
              if (((pxVar41 != (xmlDocPtr)0x0) && (api_doc != pxVar41)) && (pxVar41->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar41);
                iVar4 = extraout_EDX_09;
              }
              des_xmlNodePtr(iVar1,(xmlNodePtr)pxVar55,iVar4);
              xmlResetLastError();
              iVar4 = xmlMemBlocks();
              if (iVar3 != iVar4) {
                iVar4 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlDOMWrapCloneNode",(ulong)(uint)(iVar4 - iVar3)
                      );
                test_ret_18 = test_ret_18 + 1;
                printf(" %d",0);
                printf(" %d",(ulong)uVar51);
                printf(" %d",(ulong)uVar58);
                printf(" %d",0);
                printf(" %d",(ulong)uVar61);
                printf(" %d",iVar1);
                printf(" %d",(ulong)uVar60);
                printf(" %d");
                putchar(10);
                pxVar55 = pxVar35;
              }
              uVar53 = uVar53 + 1;
              pxVar35 = (xmlDocPtr)(ulong)uVar53;
              puVar48 = puVar48 + 1;
            } while (uVar53 != 4);
            uVar60 = uVar60 + 1;
          } while (uVar60 != 4);
          iVar1 = iVar1 + 1;
        } while (iVar1 != 3);
        uVar61 = uVar61 + 1;
      } while (uVar61 != 4);
      uVar58 = uVar58 + 1;
    } while (uVar58 != 3);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  uVar51 = 0;
  do {
    puVar48 = &DAT_0015fd28;
    uVar58 = 0;
    do {
      iVar3 = (int)pxVar55;
      iVar1 = xmlMemBlocks();
      pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar51,iVar3);
      uVar54 = 0xffffffff;
      if (uVar58 < 4) {
        uVar54 = *puVar48;
      }
      xmlDOMWrapReconcileNamespaces(0,pxVar55,uVar54);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar51,(xmlNodePtr)pxVar55,nr_08);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar1 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDOMWrapReconcileNamespaces",
               (ulong)(uint)(iVar3 - iVar1));
        test_ret_2 = test_ret_2 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar51);
        pxVar55 = (xmlDocPtr)(ulong)uVar58;
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
      puVar48 = puVar48 + 1;
    } while (uVar58 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar1 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      pxVar35 = (xmlDocPtr)0x0;
      puVar48 = &DAT_0015fd28;
      do {
        iVar4 = (int)pxVar55;
        iVar3 = xmlMemBlocks();
        pxVar40 = gen_xmlDocPtr(uVar51,iVar4);
        pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar58,iVar4);
        uVar54 = 0xffffffff;
        uVar61 = (uint)pxVar35;
        if (uVar61 < 4) {
          uVar54 = *puVar48;
        }
        xmlDOMWrapRemoveNode(0,pxVar40,pxVar55,uVar54);
        call_tests = call_tests + 1;
        iVar4 = extraout_EDX_10;
        if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
          xmlFreeDoc(pxVar40);
          iVar4 = extraout_EDX_11;
        }
        des_xmlNodePtr(uVar58,(xmlNodePtr)pxVar55,iVar4);
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDOMWrapRemoveNode",(ulong)(uint)(iVar4 - iVar3));
          iVar1 = iVar1 + 1;
          printf(" %d",0);
          printf(" %d",(ulong)uVar51);
          printf(" %d",(ulong)uVar58);
          printf(" %d");
          putchar(10);
          pxVar55 = pxVar35;
        }
        uVar61 = uVar61 + 1;
        pxVar35 = (xmlDocPtr)(ulong)uVar61;
        puVar48 = puVar48 + 1;
      } while (uVar61 != 4);
      uVar58 = uVar58 + 1;
    } while (uVar58 != 3);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      pxVar35 = (xmlDocPtr)0x0;
      puVar48 = &DAT_0015fd28;
      do {
        iVar5 = (int)pxVar55;
        iVar4 = xmlMemBlocks();
        pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar51,iVar5);
        pxVar40 = gen_xmlDocPtr(uVar58,iVar5);
        uVar54 = 0xffffffff;
        uVar61 = (uint)pxVar35;
        if (uVar61 < 4) {
          uVar54 = *puVar48;
        }
        pxVar33 = (xmlNodePtr)xmlDocCopyNode(pxVar55,pxVar40,uVar54);
        desret_xmlNodePtr(pxVar33);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar51,(xmlNodePtr)pxVar55,nr_09);
        if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
          xmlFreeDoc(pxVar40);
        }
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar4 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDocCopyNode",(ulong)(uint)(iVar5 - iVar4));
          iVar3 = iVar3 + 1;
          printf(" %d",(ulong)uVar51);
          printf(" %d",(ulong)uVar58);
          printf(" %d");
          putchar(10);
          pxVar55 = pxVar35;
        }
        uVar61 = uVar61 + 1;
        pxVar35 = (xmlDocPtr)(ulong)uVar61;
        puVar48 = puVar48 + 1;
      } while (uVar61 != 4);
      uVar58 = uVar58 + 1;
    } while (uVar58 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  iVar26 = iVar26 + test_ret_17 + iVar2 + test_ret_18 + test_ret_2;
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar51 = 0;
  do {
    pxVar35 = (xmlDocPtr)0x0;
    do {
      iVar4 = (int)pxVar55;
      iVar5 = xmlMemBlocks();
      pxVar40 = gen_xmlDocPtr(uVar51,iVar4);
      iVar6 = (int)pxVar35;
      pxVar55 = (xmlDocPtr)gen_xmlNodePtr(iVar6,iVar4);
      pxVar33 = (xmlNodePtr)xmlDocCopyNodeList(pxVar40,pxVar55);
      desret_xmlNodePtr(pxVar33);
      call_tests = call_tests + 1;
      iVar4 = extraout_EDX_12;
      if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
        xmlFreeDoc(pxVar40);
        iVar4 = extraout_EDX_13;
      }
      des_xmlNodePtr(iVar6,(xmlNodePtr)pxVar55,iVar4);
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar5 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDocCopyNodeList",(ulong)(uint)(iVar4 - iVar5));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d");
        putchar(10);
        pxVar55 = pxVar35;
      }
      pxVar35 = (xmlDocPtr)(ulong)(iVar6 + 1U);
    } while (iVar6 + 1U != 3);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      iVar6 = (int)pxVar55;
      iVar5 = xmlMemBlocks();
      if (uVar51 == 0) {
        iVar6 = 0x152a66;
        pFVar43 = fopen64("test.out","a+");
      }
      else {
        pFVar43 = (FILE *)0x0;
      }
      pxVar35 = gen_xmlDocPtr(uVar58,iVar6);
      pxVar55 = pxVar35;
      xmlDocDump(pFVar43);
      call_tests = call_tests + 1;
      if (pFVar43 != (FILE *)0x0) {
        fclose(pFVar43);
      }
      if (((pxVar35 != (xmlDocPtr)0x0) && (api_doc != pxVar35)) && (pxVar35->doc != api_doc)) {
        xmlFreeDoc(pxVar35);
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDocDump",(ulong)(uint)(iVar6 - iVar5));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar51);
        pxVar55 = (xmlDocPtr)(ulong)uVar58;
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
    } while (uVar58 != 4);
    bVar66 = uVar51 == 0;
    uVar51 = uVar51 + 1;
  } while (bVar66);
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  uVar51 = 0;
  do {
    uVar42 = 0;
    do {
      uVar58 = 0;
      iVar5 = (int)uVar42;
      uVar39 = 0;
      if (iVar5 == 0) {
        uVar39 = 0x1658d8;
      }
      puVar48 = &DAT_0015fd28;
      do {
        iVar7 = (int)pxVar55;
        iVar6 = xmlMemBlocks();
        pxVar35 = gen_xmlDocPtr(uVar51,iVar7);
        uVar54 = 0xffffffff;
        if (uVar58 < 4) {
          uVar54 = *puVar48;
        }
        pxVar55 = (xmlDocPtr)0x0;
        xmlDocDumpFormatMemory(pxVar35,0,uVar39,uVar54);
        call_tests = call_tests + 1;
        if (((pxVar35 != (xmlDocPtr)0x0) && (api_doc != pxVar35)) && (pxVar35->doc != api_doc)) {
          xmlFreeDoc(pxVar35);
        }
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDocDumpFormatMemory",(ulong)(uint)(iVar7 - iVar6));
          test_ret_2 = test_ret_2 + 1;
          printf(" %d",(ulong)uVar51);
          printf(" %d",0);
          printf(" %d",uVar42);
          pxVar55 = (xmlDocPtr)(ulong)uVar58;
          printf(" %d");
          putchar(10);
        }
        uVar58 = uVar58 + 1;
        puVar48 = puVar48 + 1;
      } while (uVar58 != 4);
      uVar42 = (ulong)(iVar5 + 1);
    } while (iVar5 == 0);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar51 = 0;
  do {
    uVar42 = 0;
    do {
      uVar58 = 0;
      iVar6 = (int)uVar42;
      uVar39 = 0;
      if (iVar6 == 0) {
        uVar39 = 0x1658d8;
      }
      do {
        puVar48 = &DAT_0015fd28;
        pxVar35 = (xmlDocPtr)0x0;
        do {
          iVar8 = (int)pxVar55;
          iVar7 = xmlMemBlocks();
          pxVar40 = gen_xmlDocPtr(uVar51,iVar8);
          if (uVar58 < 3) {
            uVar47 = (&DAT_00162d50)[uVar58];
          }
          else {
            uVar47 = 0;
          }
          uVar54 = 0xffffffff;
          uVar61 = (uint)pxVar35;
          if (uVar61 < 4) {
            uVar54 = *puVar48;
          }
          pxVar55 = (xmlDocPtr)0x0;
          xmlDocDumpFormatMemoryEnc(pxVar40,0,uVar39,uVar47,uVar54);
          call_tests = call_tests + 1;
          if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
            xmlFreeDoc(pxVar40);
          }
          xmlResetLastError();
          iVar8 = xmlMemBlocks();
          if (iVar7 != iVar8) {
            iVar8 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlDocDumpFormatMemoryEnc",
                   (ulong)(uint)(iVar8 - iVar7));
            iVar5 = iVar5 + 1;
            printf(" %d",(ulong)uVar51);
            printf(" %d",0);
            printf(" %d",uVar42);
            printf(" %d",(ulong)uVar58);
            printf(" %d");
            putchar(10);
            pxVar55 = pxVar35;
          }
          uVar61 = uVar61 + 1;
          pxVar35 = (xmlDocPtr)(ulong)uVar61;
          puVar48 = puVar48 + 1;
        } while (uVar61 != 4);
        uVar58 = uVar58 + 1;
      } while (uVar58 != 4);
      uVar42 = (ulong)(iVar6 + 1);
    } while (iVar6 == 0);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      iVar8 = (int)pxVar55;
      iVar7 = xmlMemBlocks();
      pxVar35 = gen_xmlDocPtr(uVar51,iVar8);
      uVar39 = 0;
      if (uVar58 == 0) {
        uVar39 = 0x1658d8;
      }
      pxVar55 = (xmlDocPtr)0x0;
      xmlDocDumpMemory(pxVar35,0,uVar39);
      call_tests = call_tests + 1;
      if (((pxVar35 != (xmlDocPtr)0x0) && (api_doc != pxVar35)) && (pxVar35->doc != api_doc)) {
        xmlFreeDoc(pxVar35);
      }
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDocDumpMemory",(ulong)(uint)(iVar8 - iVar7));
        iVar6 = iVar6 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d",0);
        pxVar55 = (xmlDocPtr)(ulong)uVar58;
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
    } while (uVar58 == 1);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  iVar26 = iVar26 + iVar1 + iVar3 + iVar2 + iVar4 + test_ret_2;
  function_tests = function_tests + 1;
  iVar1 = 0;
  uVar51 = 0;
  do {
    uVar42 = 0;
    do {
      pxVar35 = (xmlDocPtr)0x0;
      iVar2 = (int)uVar42;
      uVar39 = 0;
      if (iVar2 == 0) {
        uVar39 = 0x1658d8;
      }
      puVar64 = &DAT_00162d50;
      do {
        iVar4 = (int)pxVar55;
        iVar3 = xmlMemBlocks();
        pxVar40 = gen_xmlDocPtr(uVar51,iVar4);
        uVar58 = (uint)pxVar35;
        if (uVar58 < 3) {
          uVar47 = *puVar64;
        }
        else {
          uVar47 = 0;
        }
        pxVar55 = (xmlDocPtr)0x0;
        xmlDocDumpMemoryEnc(pxVar40,0,uVar39,uVar47);
        call_tests = call_tests + 1;
        if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
          xmlFreeDoc(pxVar40);
        }
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDocDumpMemoryEnc",(ulong)(uint)(iVar4 - iVar3));
          iVar1 = iVar1 + 1;
          printf(" %d",(ulong)uVar51);
          printf(" %d",0);
          printf(" %d",uVar42);
          printf(" %d");
          putchar(10);
          pxVar55 = pxVar35;
        }
        uVar58 = uVar58 + 1;
        pxVar35 = (xmlDocPtr)(ulong)uVar58;
        puVar64 = puVar64 + 1;
      } while (uVar58 != 4);
      uVar42 = (ulong)(iVar2 + 1);
    } while (iVar2 == 0);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  iVar2 = 0;
  _test_ret_1 = (xmlDocPtr)0x0;
  do {
    uVar51 = 0;
    do {
      pxVar35 = (xmlDocPtr)0x0;
      puVar48 = &DAT_0015fd28;
      do {
        iVar4 = (int)pxVar55;
        iVar3 = xmlMemBlocks();
        if (test_ret_1 == 0) {
          iVar4 = 0x152a66;
          pFVar43 = fopen64("test.out","a+");
        }
        else {
          pFVar43 = (FILE *)0x0;
        }
        pxVar40 = gen_xmlDocPtr(uVar51,iVar4);
        uVar54 = 0xffffffff;
        uVar58 = (uint)pxVar35;
        if (uVar58 < 4) {
          uVar54 = *puVar48;
        }
        pxVar55 = pxVar40;
        xmlDocFormatDump(pFVar43,pxVar40,uVar54);
        call_tests = call_tests + 1;
        if (pFVar43 != (FILE *)0x0) {
          fclose(pFVar43);
        }
        if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
          xmlFreeDoc(pxVar40);
        }
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDocFormatDump",(ulong)(uint)(iVar4 - iVar3));
          iVar2 = iVar2 + 1;
          printf(" %d",_test_ret_1);
          printf(" %d",(ulong)uVar51);
          printf(" %d");
          putchar(10);
          pxVar55 = pxVar35;
        }
        uVar58 = uVar58 + 1;
        pxVar35 = (xmlDocPtr)(ulong)uVar58;
        puVar48 = puVar48 + 1;
      } while (uVar58 != 4);
      uVar51 = uVar51 + 1;
    } while (uVar51 != 4);
    bVar66 = test_ret_1 == 0;
    _test_ret_1 = (xmlDocPtr)(ulong)(test_ret_1 + 1);
  } while (bVar66);
  function_tests = function_tests + 1;
  iVar3 = xmlMemBlocks();
  pxVar33 = (xmlNodePtr)xmlDocGetRootElement(0);
  desret_xmlNodePtr(pxVar33);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlDocGetRootElement");
    pxVar55 = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar51 = 0;
  iVar7 = 0;
  do {
    uVar58 = 0;
    do {
      iVar9 = (int)pxVar55;
      iVar8 = xmlMemBlocks();
      pxVar35 = gen_xmlDocPtr(uVar51,iVar9);
      if (uVar58 == 0) {
        pxVar40 = (xmlDocPtr)xmlNewPI("test",0);
      }
      else {
        pxVar40 = (xmlDocPtr)0x0;
      }
      pxVar55 = pxVar40;
      pxVar33 = (xmlNodePtr)xmlDocSetRootElement(pxVar35);
      if (pxVar35 == (xmlDocPtr)0x0) {
        xmlFreeNode(pxVar40);
        desret_xmlNodePtr(pxVar33);
        call_tests = call_tests + 1;
      }
      else {
        desret_xmlNodePtr(pxVar33);
        call_tests = call_tests + 1;
        if ((api_doc != pxVar35) && (pxVar35->doc != api_doc)) {
          xmlFreeDoc(pxVar35);
        }
      }
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDocSetRootElement",(ulong)(uint)(iVar9 - iVar8));
        iVar7 = iVar7 + 1;
        printf(" %d",(ulong)uVar51);
        pxVar55 = (xmlDocPtr)(ulong)uVar58;
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
    } while (uVar58 != 3);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  iVar8 = 0;
  _test_ret_1 = (xmlDocPtr)0x0;
  do {
    uVar51 = 0;
    do {
      pxVar35 = (xmlDocPtr)0x0;
      do {
        iVar10 = (int)pxVar55;
        iVar9 = xmlMemBlocks();
        if (test_ret_1 == 0) {
          iVar10 = 0x152a66;
          pFVar43 = fopen64("test.out","a+");
        }
        else {
          pFVar43 = (FILE *)0x0;
        }
        pxVar40 = gen_xmlDocPtr(uVar51,iVar10);
        iVar11 = (int)pxVar35;
        pxVar55 = (xmlDocPtr)gen_xmlNodePtr(iVar11,iVar10);
        xmlElemDump(pFVar43,pxVar40,pxVar55);
        call_tests = call_tests + 1;
        iVar10 = extraout_EDX_14;
        if (pFVar43 != (FILE *)0x0) {
          fclose(pFVar43);
          iVar10 = extraout_EDX_15;
        }
        if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
          xmlFreeDoc(pxVar40);
          iVar10 = extraout_EDX_16;
        }
        des_xmlNodePtr(iVar11,(xmlNodePtr)pxVar55,iVar10);
        xmlResetLastError();
        iVar10 = xmlMemBlocks();
        if (iVar9 != iVar10) {
          iVar10 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlElemDump",(ulong)(uint)(iVar10 - iVar9));
          iVar8 = iVar8 + 1;
          printf(" %d",_test_ret_1);
          printf(" %d",(ulong)uVar51);
          printf(" %d");
          putchar(10);
          pxVar55 = pxVar35;
        }
        pxVar35 = (xmlDocPtr)(ulong)(iVar11 + 1U);
      } while (iVar11 + 1U != 3);
      uVar51 = uVar51 + 1;
    } while (uVar51 != 4);
    bVar66 = test_ret_1 == 0;
    _test_ret_1 = (xmlDocPtr)(ulong)(test_ret_1 + 1);
  } while (bVar66);
  test_ret_2 = (int)(iVar3 != iVar4);
  function_tests = function_tests + 1;
  uVar51 = 0;
  iVar3 = 0;
  do {
    iVar9 = (int)pxVar55;
    iVar4 = xmlMemBlocks();
    pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar51,iVar9);
    pxVar33 = (xmlNodePtr)xmlFirstElementChild(pxVar55);
    desret_xmlNodePtr(pxVar33);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar51,(xmlNodePtr)pxVar55,nr_10);
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar4 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlFirstElementChild",(ulong)(uint)(iVar9 - iVar4));
      iVar3 = iVar3 + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar4 = xmlMemBlocks();
  xmlGetBufferAllocationScheme();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar9 = xmlMemBlocks();
  if (iVar4 != iVar9) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetBufferAllocationScheme");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar10 = xmlMemBlocks();
  xmlGetCompressMode();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar11 = xmlMemBlocks();
  if (iVar10 != iVar11) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetCompressMode");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar27 = xmlMemBlocks();
  xmlGetDocCompressMode(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar52 = xmlMemBlocks();
  if (iVar27 != iVar52) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetDocCompressMode");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar12 = xmlMemBlocks();
  pxVar33 = (xmlNodePtr)xmlGetIntSubset(0);
  desret_xmlNodePtr(pxVar33);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar13 = xmlMemBlocks();
  if (iVar12 != iVar13) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetIntSubset");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar14 = xmlMemBlocks();
  pxVar33 = (xmlNodePtr)xmlGetLastChild(0);
  desret_xmlNodePtr(pxVar33);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar15 = xmlMemBlocks();
  if (iVar14 != iVar15) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetLastChild");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar16 = xmlMemBlocks();
  xmlGetLineNo(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar17 = xmlMemBlocks();
  if (iVar16 != iVar17) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetLineNo");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar18 = 0;
  iVar19 = 0;
  do {
    iVar20 = xmlMemBlocks();
    lVar37 = xmlGetNoNsProp(0);
    if (lVar37 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar21 = xmlMemBlocks();
    if (iVar20 != iVar21) {
      iVar21 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlGetNoNsProp",(ulong)(uint)(iVar21 - iVar20));
      iVar19 = iVar19 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    iVar18 = iVar18 + 1;
  } while (iVar18 != 5);
  function_tests = function_tests + 1;
  iVar18 = xmlMemBlocks();
  lVar37 = xmlGetNodePath(0);
  if (lVar37 != 0) {
    (*_xmlFree)(lVar37);
  }
  test_ret_1 = (int)(iVar16 != iVar17);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar16 = xmlMemBlocks();
  if (iVar18 != iVar16) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetNodePath");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar17 = 0;
  uVar51 = 0;
  do {
    puVar64 = &DAT_00162d68;
    uVar58 = 0;
    do {
      iVar20 = xmlMemBlocks();
      if (uVar51 < 4) {
        uVar39 = (&DAT_00162d68)[uVar51];
      }
      else {
        uVar39 = 0;
      }
      if (uVar58 < 4) {
        uVar47 = *puVar64;
      }
      else {
        uVar47 = 0;
      }
      lVar37 = xmlGetNsProp(0,uVar39,uVar47);
      if (lVar37 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar21 = xmlMemBlocks();
      if (iVar20 != iVar21) {
        iVar21 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlGetNsProp",(ulong)(uint)(iVar21 - iVar20));
        iVar17 = iVar17 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar51);
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
      puVar64 = puVar64 + 1;
    } while (uVar58 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  iVar21 = 0;
  iVar20 = 0;
  do {
    iVar22 = xmlMemBlocks();
    lVar37 = xmlGetProp(0);
    if (lVar37 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar23 = xmlMemBlocks();
    if (iVar22 != iVar23) {
      iVar23 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlGetProp",(ulong)(uint)(iVar23 - iVar22));
      iVar20 = iVar20 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    iVar21 = iVar21 + 1;
  } while (iVar21 != 5);
  function_tests = function_tests + 1;
  test_ret = 0;
  uVar51 = 0;
  do {
    puVar64 = &DAT_00162d68;
    uVar58 = 0;
    do {
      iVar21 = xmlMemBlocks();
      if (uVar51 < 4) {
        uVar39 = (&DAT_00162d68)[uVar51];
      }
      else {
        uVar39 = 0;
      }
      if (uVar58 < 4) {
        uVar47 = *puVar64;
      }
      else {
        uVar47 = 0;
      }
      lVar37 = xmlHasNsProp(0,uVar39,uVar47);
      if (lVar37 != 0) {
        xmlUnlinkNode(lVar37);
        xmlFreeNode();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar22 = xmlMemBlocks();
      if (iVar21 != iVar22) {
        iVar22 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlHasNsProp",(ulong)(uint)(iVar22 - iVar21));
        test_ret = test_ret + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar51);
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
      puVar64 = puVar64 + 1;
    } while (uVar58 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  iVar21 = 0;
  iVar22 = 0;
  do {
    iVar23 = xmlMemBlocks();
    lVar37 = xmlHasProp(0);
    if (lVar37 != 0) {
      xmlUnlinkNode(lVar37);
      xmlFreeNode();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar24 = xmlMemBlocks();
    if (iVar23 != iVar24) {
      iVar24 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlHasProp",(ulong)(uint)(iVar24 - iVar23));
      iVar22 = iVar22 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    iVar21 = iVar21 + 1;
  } while (iVar21 != 5);
  function_tests = function_tests + 1;
  iVar21 = xmlMemBlocks();
  xmlIsBlankNode(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar23 = xmlMemBlocks();
  if (iVar21 != iVar23) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlIsBlankNode");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar24 = 0;
  uVar51 = 0;
  do {
    pxVar33 = (xmlNodePtr)0x0;
    puVar64 = &DAT_00162d68;
    do {
      iVar25 = xmlMemBlocks();
      if (uVar51 < 4) {
        uVar39 = (&DAT_00162d68)[uVar51];
      }
      else {
        uVar39 = 0;
      }
      uVar58 = (uint)pxVar33;
      if (uVar58 < 4) {
        pxVar44 = (xmlNodePtr)*puVar64;
      }
      else {
        pxVar44 = (xmlNodePtr)0x0;
      }
      xmlIsXHTML(uVar39);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar28 = xmlMemBlocks();
      if (iVar25 != iVar28) {
        iVar28 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlIsXHTML",(ulong)(uint)(iVar28 - iVar25));
        iVar24 = iVar24 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d");
        putchar(10);
        pxVar44 = pxVar33;
      }
      uVar58 = uVar58 + 1;
      pxVar33 = (xmlNodePtr)(ulong)uVar58;
      puVar64 = puVar64 + 1;
    } while (uVar58 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  uVar51 = 0;
  iVar25 = 0;
  do {
    iVar29 = (int)pxVar44;
    iVar28 = xmlMemBlocks();
    pxVar44 = gen_xmlNodePtr(uVar51,iVar29);
    pxVar33 = (xmlNodePtr)xmlLastElementChild(pxVar44);
    desret_xmlNodePtr(pxVar33);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar51,pxVar44,nr_11);
    xmlResetLastError();
    iVar29 = xmlMemBlocks();
    if (iVar28 != iVar29) {
      iVar29 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlLastElementChild",(ulong)(uint)(iVar29 - iVar28));
      iVar25 = iVar25 + 1;
      pxVar44 = (xmlNodePtr)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar28 = 0;
  uVar51 = 0;
  do {
    iVar29 = 0;
    do {
      pxVar33 = (xmlNodePtr)0x0;
      piVar65 = &DAT_0015fd28;
      do {
        iVar30 = xmlMemBlocks();
        pxVar55 = gen_xmlDocPtr(uVar51,(int)pxVar44);
        switch(iVar29) {
        case 0:
          bVar66 = false;
          pcVar62 = "foo";
          break;
        case 1:
          bVar66 = false;
          pcVar62 = "<foo/>";
          break;
        case 2:
          bVar66 = false;
          pcVar62 = anon_var_dwarf_1b8;
          break;
        case 3:
          bVar66 = false;
          pcVar62 = " 2ab ";
          break;
        default:
          bVar66 = true;
          pcVar62 = (char *)0x0;
        }
        iVar31 = -1;
        uVar58 = (uint)pxVar33;
        if (uVar58 < 4) {
          iVar31 = *piVar65;
        }
        if ((bVar66) || (sVar38 = strlen(pcVar62), iVar31 <= (int)sVar38 + 1)) {
          pxVar44 = (xmlNodePtr)xmlNewCDataBlock(pxVar55,pcVar62,iVar31);
          desret_xmlNodePtr(pxVar44);
          call_tests = call_tests + 1;
          if ((pxVar55 != (xmlDocPtr)0x0) && ((api_doc != pxVar55 && (pxVar55->doc != api_doc)))) {
            xmlFreeDoc(pxVar55);
          }
          xmlResetLastError();
          iVar31 = xmlMemBlocks();
          pxVar44 = (xmlNodePtr)pcVar62;
          if (iVar30 != iVar31) {
            iVar31 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewCDataBlock",(ulong)(uint)(iVar31 - iVar30));
            iVar28 = iVar28 + 1;
            printf(" %d",(ulong)uVar51);
            printf(" %d",iVar29);
            printf(" %d");
            putchar(10);
            pxVar44 = pxVar33;
          }
        }
        uVar58 = uVar58 + 1;
        pxVar33 = (xmlNodePtr)(ulong)uVar58;
        piVar65 = piVar65 + 1;
      } while (uVar58 != 4);
      iVar29 = iVar29 + 1;
    } while (iVar29 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  test_ret_4 = 0;
  uVar51 = 0;
  do {
    puVar64 = &DAT_00162d68;
    pxVar33 = (xmlNodePtr)0x0;
    do {
      iVar30 = (int)pxVar44;
      iVar29 = xmlMemBlocks();
      pxVar55 = gen_xmlDocPtr(uVar51,iVar30);
      uVar58 = (uint)pxVar33;
      if (uVar58 < 4) {
        pxVar44 = (xmlNodePtr)*puVar64;
      }
      else {
        pxVar44 = (xmlNodePtr)0x0;
      }
      pxVar45 = (xmlNodePtr)xmlNewCharRef(pxVar55);
      desret_xmlNodePtr(pxVar45);
      call_tests = call_tests + 1;
      if (((pxVar55 != (xmlDocPtr)0x0) && (api_doc != pxVar55)) && (pxVar55->doc != api_doc)) {
        xmlFreeDoc(pxVar55);
      }
      xmlResetLastError();
      iVar30 = xmlMemBlocks();
      if (iVar29 != iVar30) {
        iVar30 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewCharRef",(ulong)(uint)(iVar30 - iVar29));
        test_ret_4 = test_ret_4 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d");
        putchar(10);
        pxVar44 = pxVar33;
      }
      uVar58 = uVar58 + 1;
      pxVar33 = (xmlNodePtr)(ulong)uVar58;
      puVar64 = puVar64 + 1;
    } while (uVar58 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  iVar29 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      uVar42 = 0;
      do {
        puVar64 = &DAT_00162d68;
        pxVar33 = (xmlNodePtr)0x0;
        do {
          iVar31 = (int)pxVar44;
          iVar30 = xmlMemBlocks();
          pxVar44 = gen_xmlNodePtr(uVar51,iVar31);
          if (uVar58 == 0) {
            get_api_root();
            pxVar49 = api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              pxVar49 = api_root->nsDef;
              api_ns = pxVar49;
            }
          }
          else {
            pxVar49 = (xmlNs *)0x0;
          }
          if ((uint)uVar42 < 4) {
            uVar39 = (&DAT_00162d68)[uVar42];
          }
          else {
            uVar39 = 0;
          }
          uVar61 = (uint)pxVar33;
          if (uVar61 < 4) {
            uVar47 = *puVar64;
          }
          else {
            uVar47 = 0;
          }
          pxVar45 = (xmlNodePtr)xmlNewChild(pxVar44,pxVar49,uVar39,uVar47);
          desret_xmlNodePtr(pxVar45);
          call_tests = call_tests + 1;
          des_xmlNodePtr(uVar51,pxVar44,nr_12);
          if (uVar58 == 0) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar31 = xmlMemBlocks();
          if (iVar30 != iVar31) {
            iVar31 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewChild",(ulong)(uint)(iVar31 - iVar30));
            iVar29 = iVar29 + 1;
            printf(" %d",(ulong)uVar51);
            printf(" %d",(ulong)uVar58);
            printf(" %d",uVar42);
            printf(" %d");
            putchar(10);
            pxVar44 = pxVar33;
          }
          uVar61 = uVar61 + 1;
          pxVar33 = (xmlNodePtr)(ulong)uVar61;
          puVar64 = puVar64 + 1;
        } while (uVar61 != 5);
        uVar61 = (uint)uVar42 + 1;
        uVar42 = (ulong)uVar61;
      } while (uVar61 != 5);
      bVar66 = uVar58 == 0;
      uVar58 = uVar58 + 1;
    } while (bVar66);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  puVar64 = &DAT_00162d68;
  uVar51 = 0;
  iVar30 = 0;
  do {
    iVar31 = xmlMemBlocks();
    if (uVar51 < 4) {
      uVar39 = *puVar64;
    }
    else {
      uVar39 = 0;
    }
    pxVar33 = (xmlNodePtr)xmlNewComment(uVar39);
    desret_xmlNodePtr(pxVar33);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar32 = xmlMemBlocks();
    if (iVar31 != iVar32) {
      iVar32 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewComment",(ulong)(uint)(iVar32 - iVar31));
      iVar30 = iVar30 + 1;
      pxVar44 = (xmlNodePtr)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
    puVar64 = puVar64 + 1;
  } while (uVar51 != 5);
  iVar1 = iVar26 + iVar5 + iVar6 + iVar1 + iVar2 + test_ret_2 + iVar7 + iVar8 + iVar3 +
          (uint)(iVar4 != iVar9) + (uint)(iVar10 != iVar11) + (uint)(iVar27 != iVar52) +
          (uint)(iVar12 != iVar13) + (uint)(iVar14 != iVar15) + test_ret_1 + iVar19 +
          (uint)(iVar18 != iVar16) + iVar17 + iVar20 + test_ret + iVar22 + (uint)(iVar21 != iVar23)
          + iVar24 + iVar25 + iVar28 + test_ret_4;
  function_tests = function_tests + 1;
  puVar64 = &DAT_00162d68;
  uVar51 = 0;
  iVar26 = 0;
  do {
    iVar2 = xmlMemBlocks();
    if (uVar51 < 4) {
      uVar39 = *puVar64;
    }
    else {
      uVar39 = 0;
    }
    pxVar55 = (xmlDocPtr)xmlNewDoc(uVar39);
    if (api_doc != pxVar55) {
      xmlFreeDoc();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewDoc",(ulong)(uint)(iVar3 - iVar2));
      iVar26 = iVar26 + 1;
      pxVar44 = (xmlNodePtr)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
    puVar64 = puVar64 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar51 = 0;
  do {
    puVar64 = &DAT_00162d68;
    pxVar33 = (xmlNodePtr)0x0;
    do {
      iVar4 = (int)pxVar44;
      iVar3 = xmlMemBlocks();
      pxVar55 = gen_xmlDocPtr(uVar51,iVar4);
      uVar58 = (uint)pxVar33;
      if (uVar58 < 4) {
        pxVar44 = (xmlNodePtr)*puVar64;
      }
      else {
        pxVar44 = (xmlNodePtr)0x0;
      }
      pxVar45 = (xmlNodePtr)xmlNewDocComment(pxVar55);
      desret_xmlNodePtr(pxVar45);
      call_tests = call_tests + 1;
      if (((pxVar55 != (xmlDocPtr)0x0) && (api_doc != pxVar55)) && (pxVar55->doc != api_doc)) {
        xmlFreeDoc(pxVar55);
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewDocComment",(ulong)(uint)(iVar4 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d");
        putchar(10);
        pxVar44 = pxVar33;
      }
      uVar58 = uVar58 + 1;
      pxVar33 = (xmlNodePtr)(ulong)uVar58;
      puVar64 = puVar64 + 1;
    } while (uVar58 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  uVar51 = 0;
  iVar3 = 0;
  do {
    iVar4 = xmlMemBlocks();
    pxVar55 = gen_xmlDocPtr(uVar51,(int)pxVar44);
    pxVar33 = (xmlNodePtr)xmlNewDocFragment(pxVar55);
    desret_xmlNodePtr(pxVar33);
    call_tests = call_tests + 1;
    if (((pxVar55 != (xmlDocPtr)0x0) && (api_doc != pxVar55)) && (pxVar55->doc != api_doc)) {
      xmlFreeDoc(pxVar55);
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewDocFragment",(ulong)(uint)(iVar5 - iVar4));
      iVar3 = iVar3 + 1;
      pxVar44 = (xmlNodePtr)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  test_ret_4 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      uVar42 = 0;
      do {
        puVar64 = &DAT_00162d68;
        uVar61 = 0;
        do {
          iVar5 = (int)pxVar44;
          iVar4 = xmlMemBlocks();
          pxVar55 = gen_xmlDocPtr(uVar51,iVar5);
          if (uVar58 == 0) {
            get_api_root();
            pxVar44 = (xmlNodePtr)api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              pxVar44 = (xmlNodePtr)api_root->nsDef;
              api_ns = (xmlNsPtr)pxVar44;
            }
          }
          else {
            pxVar44 = (xmlNodePtr)0x0;
          }
          if ((uint)uVar42 < 4) {
            uVar39 = (&DAT_00162d68)[uVar42];
          }
          else {
            uVar39 = 0;
          }
          if (uVar61 < 4) {
            uVar47 = *puVar64;
          }
          else {
            uVar47 = 0;
          }
          pxVar33 = (xmlNodePtr)xmlNewDocNode(pxVar55,pxVar44,uVar39,uVar47);
          desret_xmlNodePtr(pxVar33);
          call_tests = call_tests + 1;
          if (((pxVar55 != (xmlDocPtr)0x0) && (api_doc != pxVar55)) && (pxVar55->doc != api_doc)) {
            xmlFreeDoc(pxVar55);
          }
          if (uVar58 == 0) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar4 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewDocNode",(ulong)(uint)(iVar5 - iVar4));
            test_ret_4 = test_ret_4 + 1;
            printf(" %d",(ulong)uVar51);
            printf(" %d",(ulong)uVar58);
            printf(" %d",uVar42);
            pxVar44 = (xmlNodePtr)(ulong)uVar61;
            printf(" %d");
            putchar(10);
          }
          uVar61 = uVar61 + 1;
          puVar64 = puVar64 + 1;
        } while (uVar61 != 5);
        uVar61 = (uint)uVar42 + 1;
        uVar42 = (ulong)uVar61;
      } while (uVar61 != 5);
      bVar66 = uVar58 == 0;
      uVar58 = uVar58 + 1;
    } while (bVar66);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      _test_ret_1 = (xmlDocPtr)0x0;
      do {
        puVar64 = &DAT_00162d68;
        pxVar33 = (xmlNodePtr)0x0;
        do {
          iVar6 = (int)pxVar44;
          iVar5 = xmlMemBlocks();
          pxVar55 = gen_xmlDocPtr(uVar51,iVar6);
          if (uVar58 == 0) {
            get_api_root();
            pxVar44 = (xmlNodePtr)api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              pxVar44 = (xmlNodePtr)api_root->nsDef;
              api_ns = (xmlNsPtr)pxVar44;
            }
          }
          else {
            pxVar44 = (xmlNodePtr)0x0;
          }
          if (test_ret_1 == 0) {
            uVar39 = xmlStrdup("eaten");
          }
          else {
            uVar39 = 0;
          }
          uVar61 = (uint)pxVar33;
          if (uVar61 < 4) {
            uVar47 = *puVar64;
          }
          else {
            uVar47 = 0;
          }
          pxVar45 = (xmlNodePtr)xmlNewDocNodeEatName(pxVar55,pxVar44,uVar39,uVar47);
          desret_xmlNodePtr(pxVar45);
          call_tests = call_tests + 1;
          if (((pxVar55 != (xmlDocPtr)0x0) && (api_doc != pxVar55)) && (pxVar55->doc != api_doc)) {
            xmlFreeDoc(pxVar55);
          }
          if (uVar58 == 0) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          if (iVar5 != iVar6) {
            iVar6 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewDocNodeEatName",(ulong)(uint)(iVar6 - iVar5));
            iVar4 = iVar4 + 1;
            printf(" %d",(ulong)uVar51);
            printf(" %d",(ulong)uVar58);
            printf(" %d",_test_ret_1);
            printf(" %d");
            putchar(10);
            pxVar44 = pxVar33;
          }
          uVar61 = uVar61 + 1;
          pxVar33 = (xmlNodePtr)(ulong)uVar61;
          puVar64 = puVar64 + 1;
        } while (uVar61 != 5);
        bVar66 = test_ret_1 == 0;
        _test_ret_1 = (xmlDocPtr)(ulong)(test_ret_1 + 1);
      } while (bVar66);
      bVar66 = uVar58 == 0;
      uVar58 = uVar58 + 1;
    } while (bVar66);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      uVar61 = 0;
      puVar64 = &DAT_00162d68;
      do {
        iVar7 = (int)pxVar44;
        iVar6 = xmlMemBlocks();
        pxVar55 = gen_xmlDocPtr(uVar51,iVar7);
        if (uVar58 < 4) {
          pxVar44 = (xmlNodePtr)(&DAT_00162d68)[uVar58];
        }
        else {
          pxVar44 = (xmlNodePtr)0x0;
        }
        if (uVar61 < 4) {
          uVar39 = *puVar64;
        }
        else {
          uVar39 = 0;
        }
        pxVar33 = (xmlNodePtr)xmlNewDocPI(pxVar55,pxVar44,uVar39);
        desret_xmlNodePtr(pxVar33);
        call_tests = call_tests + 1;
        if (((pxVar55 != (xmlDocPtr)0x0) && (api_doc != pxVar55)) && (pxVar55->doc != api_doc)) {
          xmlFreeDoc(pxVar55);
        }
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewDocPI",(ulong)(uint)(iVar7 - iVar6));
          iVar5 = iVar5 + 1;
          printf(" %d",(ulong)uVar51);
          printf(" %d",(ulong)uVar58);
          pxVar44 = (xmlNodePtr)(ulong)uVar61;
          printf(" %d");
          putchar(10);
        }
        uVar61 = uVar61 + 1;
        puVar64 = puVar64 + 1;
      } while (uVar61 != 5);
      uVar58 = uVar58 + 1;
    } while (uVar58 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  iVar26 = iVar1 + iVar29 + iVar30 + iVar26 + iVar2 + iVar3 + test_ret_4;
  function_tests = function_tests + 1;
  test_ret_4 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      uVar61 = 0;
      puVar64 = &DAT_00162d68;
      do {
        iVar2 = (int)pxVar44;
        iVar1 = xmlMemBlocks();
        pxVar55 = gen_xmlDocPtr(uVar51,iVar2);
        if (uVar58 < 4) {
          pxVar44 = (xmlNodePtr)(&DAT_00162d68)[uVar58];
        }
        else {
          pxVar44 = (xmlNodePtr)0x0;
        }
        if (uVar61 < 4) {
          uVar39 = *puVar64;
        }
        else {
          uVar39 = 0;
        }
        lVar37 = xmlNewDocProp(pxVar55,pxVar44,uVar39);
        if (lVar37 != 0) {
          xmlUnlinkNode(lVar37);
          xmlFreeNode(lVar37);
        }
        call_tests = call_tests + 1;
        if (((pxVar55 != (xmlDocPtr)0x0) && (api_doc != pxVar55)) && (pxVar55->doc != api_doc)) {
          xmlFreeDoc(pxVar55);
        }
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewDocProp",(ulong)(uint)(iVar2 - iVar1));
          test_ret_4 = test_ret_4 + 1;
          printf(" %d",(ulong)uVar51);
          printf(" %d",(ulong)uVar58);
          pxVar44 = (xmlNodePtr)(ulong)uVar61;
          printf(" %d");
          putchar(10);
        }
        uVar61 = uVar61 + 1;
        puVar64 = puVar64 + 1;
      } while (uVar61 != 5);
      uVar58 = uVar58 + 1;
    } while (uVar58 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  test_ret = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      uVar61 = 0;
      do {
        puVar64 = &DAT_00162d68;
        pxVar33 = (xmlNodePtr)0x0;
        do {
          iVar2 = (int)pxVar44;
          iVar1 = xmlMemBlocks();
          pxVar55 = gen_xmlDocPtr(uVar51,iVar2);
          if (uVar58 == 0) {
            get_api_root();
            pxVar44 = (xmlNodePtr)api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              pxVar44 = (xmlNodePtr)api_root->nsDef;
              api_ns = (xmlNsPtr)pxVar44;
            }
          }
          else {
            pxVar44 = (xmlNodePtr)0x0;
          }
          if (uVar61 < 4) {
            uVar39 = (&DAT_00162d68)[uVar61];
          }
          else {
            uVar39 = 0;
          }
          uVar60 = (uint)pxVar33;
          if (uVar60 < 4) {
            uVar47 = *puVar64;
          }
          else {
            uVar47 = 0;
          }
          pxVar45 = (xmlNodePtr)xmlNewDocRawNode(pxVar55,pxVar44,uVar39,uVar47);
          desret_xmlNodePtr(pxVar45);
          call_tests = call_tests + 1;
          if (((pxVar55 != (xmlDocPtr)0x0) && (api_doc != pxVar55)) && (pxVar55->doc != api_doc)) {
            xmlFreeDoc(pxVar55);
          }
          if (uVar58 == 0) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewDocRawNode",(ulong)(uint)(iVar2 - iVar1));
            test_ret = test_ret + 1;
            printf(" %d",(ulong)uVar51);
            printf(" %d",(ulong)uVar58);
            printf(" %d",(ulong)uVar61);
            printf(" %d");
            putchar(10);
            pxVar44 = pxVar33;
          }
          uVar60 = uVar60 + 1;
          pxVar33 = (xmlNodePtr)(ulong)uVar60;
          puVar64 = puVar64 + 1;
        } while (uVar60 != 5);
        uVar61 = uVar61 + 1;
      } while (uVar61 != 5);
      bVar66 = uVar58 == 0;
      uVar58 = uVar58 + 1;
    } while (bVar66);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  puVar59 = &DAT_00162d68;
  uVar51 = 0;
  iVar1 = 0;
  do {
    iVar2 = xmlMemBlocks();
    if (uVar51 < 4) {
      pcVar62 = (char *)*puVar59;
    }
    else {
      pcVar62 = (char *)0x0;
    }
    pxVar33 = (xmlNodePtr)xmlNewDocText(0);
    desret_xmlNodePtr(pxVar33);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewDocText",(ulong)(uint)(iVar3 - iVar2));
      iVar1 = iVar1 + 1;
      printf(" %d",0);
      pcVar62 = (char *)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
    puVar59 = puVar59 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar51 = 0;
  do {
    iVar3 = 0;
    do {
      pcVar56 = (char *)0x0;
      piVar65 = &DAT_0015fd28;
      do {
        iVar6 = xmlMemBlocks();
        pxVar55 = gen_xmlDocPtr(uVar51,(int)pcVar62);
        switch(iVar3) {
        case 0:
          bVar66 = false;
          __s = "foo";
          break;
        case 1:
          bVar66 = false;
          __s = "<foo/>";
          break;
        case 2:
          bVar66 = false;
          __s = anon_var_dwarf_1b8;
          break;
        case 3:
          bVar66 = false;
          __s = " 2ab ";
          break;
        default:
          bVar66 = true;
          __s = (char *)0x0;
        }
        iVar7 = -1;
        uVar58 = (uint)pcVar56;
        if (uVar58 < 4) {
          iVar7 = *piVar65;
        }
        if ((bVar66) || (sVar38 = strlen(__s), iVar7 <= (int)sVar38 + 1)) {
          pxVar33 = (xmlNodePtr)xmlNewDocTextLen(pxVar55,__s,iVar7);
          desret_xmlNodePtr(pxVar33);
          call_tests = call_tests + 1;
          if ((pxVar55 != (xmlDocPtr)0x0) && ((api_doc != pxVar55 && (pxVar55->doc != api_doc)))) {
            xmlFreeDoc(pxVar55);
          }
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          pcVar62 = __s;
          if (iVar6 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewDocTextLen",(ulong)(uint)(iVar7 - iVar6));
            iVar2 = iVar2 + 1;
            printf(" %d",(ulong)uVar51);
            printf(" %d",iVar3);
            printf(" %d");
            putchar(10);
            pcVar62 = pcVar56;
          }
        }
        uVar58 = uVar58 + 1;
        pcVar56 = (char *)(ulong)uVar58;
        piVar65 = piVar65 + 1;
      } while (uVar58 != 4);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  iVar26 = iVar26 + iVar4 + iVar5 + test_ret_4 + test_ret;
  function_tests = function_tests + 1;
  test_ret = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      uVar42 = 0;
      do {
        puVar64 = &DAT_00162d68;
        pcVar56 = (char *)0x0;
        do {
          iVar4 = (int)pcVar62;
          iVar3 = xmlMemBlocks();
          pxVar55 = gen_xmlDocPtr(uVar51,iVar4);
          if (uVar58 < 4) {
            pcVar62 = (char *)(&DAT_00162d68)[uVar58];
          }
          else {
            pcVar62 = (char *)0x0;
          }
          if ((uint)uVar42 < 4) {
            uVar39 = (&DAT_00162d68)[uVar42];
          }
          else {
            uVar39 = 0;
          }
          uVar61 = (uint)pcVar56;
          if (uVar61 < 4) {
            uVar47 = *puVar64;
          }
          else {
            uVar47 = 0;
          }
          pxVar33 = (xmlNodePtr)xmlNewDtd(pxVar55,pcVar62,uVar39,uVar47);
          desret_xmlNodePtr(pxVar33);
          call_tests = call_tests + 1;
          if (((pxVar55 != (xmlDocPtr)0x0) && (api_doc != pxVar55)) && (pxVar55->doc != api_doc)) {
            xmlFreeDoc(pxVar55);
          }
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          if (iVar3 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewDtd",(ulong)(uint)(iVar4 - iVar3));
            test_ret = test_ret + 1;
            printf(" %d",(ulong)uVar51);
            printf(" %d",(ulong)uVar58);
            printf(" %d",uVar42);
            printf(" %d");
            putchar(10);
            pcVar62 = pcVar56;
          }
          uVar61 = uVar61 + 1;
          pcVar56 = (char *)(ulong)uVar61;
          puVar64 = puVar64 + 1;
        } while (uVar61 != 5);
        uVar61 = (uint)uVar42 + 1;
        uVar42 = (ulong)uVar61;
      } while (uVar61 != 5);
      uVar58 = uVar58 + 1;
    } while (uVar58 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar51 = 0;
  do {
    iVar4 = 0;
    do {
      iVar5 = xmlMemBlocks();
      if (uVar51 == 0) {
        get_api_root();
        pxVar49 = api_ns;
        if (api_root != (xmlNodePtr)0x0) {
          pxVar49 = api_root->nsDef;
          api_ns = pxVar49;
        }
      }
      else {
        pxVar49 = (xmlNs *)0x0;
      }
      pxVar33 = (xmlNodePtr)xmlNewNode(pxVar49);
      desret_xmlNodePtr(pxVar33);
      call_tests = call_tests + 1;
      if (uVar51 == 0) {
        xmlFreeDoc();
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewNode",(ulong)(uint)(iVar6 - iVar5));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d");
        putchar(10);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != 5);
    bVar66 = uVar51 == 0;
    uVar51 = uVar51 + 1;
  } while (bVar66);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      iVar5 = xmlMemBlocks();
      if (uVar51 == 0) {
        get_api_root();
        pxVar49 = api_ns;
        if (api_root != (xmlNodePtr)0x0) {
          pxVar49 = api_root->nsDef;
          api_ns = pxVar49;
        }
      }
      else {
        pxVar49 = (xmlNs *)0x0;
      }
      if (uVar58 == 0) {
        pxVar33 = (xmlNodePtr)xmlStrdup("eaten");
      }
      else {
        pxVar33 = (xmlNodePtr)0x0;
      }
      pxVar44 = (xmlNodePtr)xmlNewNodeEatName(pxVar49);
      desret_xmlNodePtr(pxVar44);
      call_tests = call_tests + 1;
      if (uVar51 == 0) {
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewNodeEatName",(ulong)(uint)(iVar6 - iVar5));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar51);
        pxVar33 = (xmlNodePtr)(ulong)uVar58;
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
    } while (uVar58 == 1);
    bVar66 = uVar51 == 0;
    uVar51 = uVar51 + 1;
  } while (bVar66);
  iVar26 = iVar26 + iVar1 + iVar2 + test_ret;
  function_tests = function_tests + 1;
  iVar1 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      uVar61 = 0;
      puVar64 = &DAT_00162d68;
      do {
        iVar5 = (int)pxVar33;
        iVar2 = xmlMemBlocks();
        pxVar33 = gen_xmlNodePtr(uVar51,iVar5);
        if (uVar58 < 4) {
          uVar39 = (&DAT_00162d68)[uVar58];
        }
        else {
          uVar39 = 0;
        }
        if (uVar61 < 4) {
          uVar47 = *puVar64;
        }
        else {
          uVar47 = 0;
        }
        auVar67 = xmlNewNs(pxVar33,uVar39,uVar47);
        iVar5 = auVar67._8_4_;
        if ((pxVar33 == (xmlNodePtr)0x0) && (auVar67._0_8_ != 0)) {
          xmlFreeNs(auVar67._0_8_);
          iVar5 = extraout_EDX_17;
        }
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar51,pxVar33,iVar5);
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar2 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewNs",(ulong)(uint)(iVar5 - iVar2));
          iVar1 = iVar1 + 1;
          printf(" %d",(ulong)uVar51);
          printf(" %d",(ulong)uVar58);
          pxVar33 = (xmlNodePtr)(ulong)uVar61;
          printf(" %d");
          putchar(10);
        }
        uVar61 = uVar61 + 1;
        puVar64 = puVar64 + 1;
      } while (uVar61 != 5);
      uVar58 = uVar58 + 1;
    } while (uVar58 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar2 = 0;
  iVar5 = 0;
  do {
    uVar51 = 0;
    do {
      uVar58 = 0;
      do {
        puVar64 = &DAT_00162d68;
        pxVar44 = (xmlNodePtr)0x0;
        do {
          iVar7 = (int)pxVar33;
          iVar6 = xmlMemBlocks();
          pxVar33 = gen_xmlNodePtr(iVar5,iVar7);
          if (uVar51 == 0) {
            get_api_root();
            pxVar49 = api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              pxVar49 = api_root->nsDef;
              api_ns = pxVar49;
            }
          }
          else {
            pxVar49 = (xmlNs *)0x0;
          }
          if (uVar58 < 4) {
            uVar39 = (&DAT_00162d68)[uVar58];
          }
          else {
            uVar39 = 0;
          }
          uVar61 = (uint)pxVar44;
          if (uVar61 < 4) {
            uVar47 = *puVar64;
          }
          else {
            uVar47 = 0;
          }
          auVar67 = xmlNewNsProp(pxVar33,pxVar49,uVar39,uVar47);
          iVar7 = auVar67._8_4_;
          lVar37 = auVar67._0_8_;
          if (lVar37 != 0) {
            xmlUnlinkNode(lVar37);
            xmlFreeNode(lVar37);
            iVar7 = extraout_EDX_18;
          }
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar5,pxVar33,iVar7);
          if (uVar51 == 0) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar6 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewNsProp",(ulong)(uint)(iVar7 - iVar6));
            iVar2 = iVar2 + 1;
            printf(" %d",iVar5);
            printf(" %d",(ulong)uVar51);
            printf(" %d",(ulong)uVar58);
            printf(" %d");
            putchar(10);
            pxVar33 = pxVar44;
          }
          uVar61 = uVar61 + 1;
          pxVar44 = (xmlNodePtr)(ulong)uVar61;
          puVar64 = puVar64 + 1;
        } while (uVar61 != 5);
        uVar58 = uVar58 + 1;
      } while (uVar58 != 5);
      bVar66 = uVar51 == 0;
      uVar51 = uVar51 + 1;
    } while (bVar66);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 3);
  function_tests = function_tests + 1;
  iVar5 = 0;
  iVar6 = 0;
  do {
    uVar51 = 0;
    do {
      _test_ret_1 = (xmlDocPtr)0x0;
      do {
        puVar64 = &DAT_00162d68;
        pxVar44 = (xmlNodePtr)0x0;
        do {
          iVar8 = (int)pxVar33;
          iVar7 = xmlMemBlocks();
          pxVar33 = gen_xmlNodePtr(iVar6,iVar8);
          if (uVar51 == 0) {
            get_api_root();
            pxVar49 = api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              pxVar49 = api_root->nsDef;
              api_ns = pxVar49;
            }
          }
          else {
            pxVar49 = (xmlNs *)0x0;
          }
          if (test_ret_1 == 0) {
            uVar39 = xmlStrdup("eaten");
          }
          else {
            uVar39 = 0;
          }
          uVar58 = (uint)pxVar44;
          if (uVar58 < 4) {
            uVar47 = *puVar64;
          }
          else {
            uVar47 = 0;
          }
          auVar67 = xmlNewNsPropEatName(pxVar33,pxVar49,uVar39,uVar47);
          iVar8 = auVar67._8_4_;
          lVar37 = auVar67._0_8_;
          if (lVar37 != 0) {
            xmlUnlinkNode(lVar37);
            xmlFreeNode(lVar37);
            iVar8 = extraout_EDX_19;
          }
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar6,pxVar33,iVar8);
          if (uVar51 == 0) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar8 = xmlMemBlocks();
          if (iVar7 != iVar8) {
            iVar8 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewNsPropEatName",(ulong)(uint)(iVar8 - iVar7));
            iVar5 = iVar5 + 1;
            printf(" %d",iVar6);
            printf(" %d",(ulong)uVar51);
            printf(" %d",_test_ret_1);
            printf(" %d");
            putchar(10);
            pxVar33 = pxVar44;
          }
          uVar58 = uVar58 + 1;
          pxVar44 = (xmlNodePtr)(ulong)uVar58;
          puVar64 = puVar64 + 1;
        } while (uVar58 != 5);
        bVar66 = test_ret_1 == 0;
        _test_ret_1 = (xmlDocPtr)(ulong)(test_ret_1 + 1);
      } while (bVar66);
      bVar66 = uVar51 == 0;
      uVar51 = uVar51 + 1;
    } while (bVar66);
    iVar6 = iVar6 + 1;
  } while (iVar6 != 3);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar51 = 0;
  do {
    puVar64 = &DAT_00162d68;
    pxVar33 = (xmlNodePtr)0x0;
    do {
      iVar7 = xmlMemBlocks();
      if (uVar51 < 4) {
        uVar39 = (&DAT_00162d68)[uVar51];
      }
      else {
        uVar39 = 0;
      }
      uVar58 = (uint)pxVar33;
      if (uVar58 < 4) {
        pxVar44 = (xmlNodePtr)*puVar64;
      }
      else {
        pxVar44 = (xmlNodePtr)0x0;
      }
      pxVar45 = (xmlNodePtr)xmlNewPI(uVar39);
      desret_xmlNodePtr(pxVar45);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewPI",(ulong)(uint)(iVar8 - iVar7));
        iVar6 = iVar6 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d");
        putchar(10);
        pxVar44 = pxVar33;
      }
      uVar58 = uVar58 + 1;
      pxVar33 = (xmlNodePtr)(ulong)uVar58;
      puVar64 = puVar64 + 1;
    } while (uVar58 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  test_ret = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      pxVar33 = (xmlNodePtr)0x0;
      puVar64 = &DAT_00162d68;
      do {
        iVar8 = (int)pxVar44;
        iVar7 = xmlMemBlocks();
        pxVar44 = gen_xmlNodePtr(uVar51,iVar8);
        if (uVar58 < 4) {
          uVar39 = (&DAT_00162d68)[uVar58];
        }
        else {
          uVar39 = 0;
        }
        uVar61 = (uint)pxVar33;
        if (uVar61 < 4) {
          uVar47 = *puVar64;
        }
        else {
          uVar47 = 0;
        }
        auVar67 = xmlNewProp(pxVar44,uVar39,uVar47);
        iVar8 = auVar67._8_4_;
        lVar37 = auVar67._0_8_;
        if (lVar37 != 0) {
          xmlUnlinkNode(lVar37);
          xmlFreeNode(lVar37);
          iVar8 = extraout_EDX_20;
        }
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar51,pxVar44,iVar8);
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar7 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewProp",(ulong)(uint)(iVar8 - iVar7));
          test_ret = test_ret + 1;
          printf(" %d",(ulong)uVar51);
          printf(" %d",(ulong)uVar58);
          printf(" %d");
          putchar(10);
          pxVar44 = pxVar33;
        }
        uVar61 = uVar61 + 1;
        pxVar33 = (xmlNodePtr)(ulong)uVar61;
        puVar64 = puVar64 + 1;
      } while (uVar61 != 5);
      uVar58 = uVar58 + 1;
    } while (uVar58 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  puVar64 = &DAT_00162d68;
  uVar51 = 0;
  iVar7 = 0;
  do {
    iVar8 = xmlMemBlocks();
    if (uVar51 < 4) {
      pxVar33 = (xmlNodePtr)*puVar64;
    }
    else {
      pxVar33 = (xmlNodePtr)0x0;
    }
    pxVar44 = (xmlNodePtr)xmlNewReference(0);
    desret_xmlNodePtr(pxVar44);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewReference",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      printf(" %d",0);
      pxVar33 = (xmlNodePtr)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
    puVar64 = puVar64 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  puVar64 = &DAT_00162d68;
  uVar51 = 0;
  iVar8 = 0;
  do {
    iVar9 = xmlMemBlocks();
    if (uVar51 < 4) {
      uVar39 = *puVar64;
    }
    else {
      uVar39 = 0;
    }
    pxVar44 = (xmlNodePtr)xmlNewText(uVar39);
    desret_xmlNodePtr(pxVar44);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewText",(ulong)(uint)(iVar10 - iVar9));
      iVar8 = iVar8 + 1;
      pxVar33 = (xmlNodePtr)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
    puVar64 = puVar64 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  iVar26 = iVar26 + iVar3 + iVar4 + iVar1 + iVar2 + iVar5 + iVar6 + test_ret;
  test_ret = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      uVar42 = 0;
      do {
        puVar64 = &DAT_00162d68;
        pxVar44 = (xmlNodePtr)0x0;
        do {
          iVar2 = (int)pxVar33;
          iVar1 = xmlMemBlocks();
          pxVar33 = gen_xmlNodePtr(uVar51,iVar2);
          if (uVar58 == 0) {
            get_api_root();
            pxVar49 = api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              pxVar49 = api_root->nsDef;
              api_ns = pxVar49;
            }
          }
          else {
            pxVar49 = (xmlNs *)0x0;
          }
          if ((uint)uVar42 < 4) {
            uVar39 = (&DAT_00162d68)[uVar42];
          }
          else {
            uVar39 = 0;
          }
          uVar61 = (uint)pxVar44;
          if (uVar61 < 4) {
            uVar47 = *puVar64;
          }
          else {
            uVar47 = 0;
          }
          pxVar45 = (xmlNodePtr)xmlNewTextChild(pxVar33,pxVar49,uVar39,uVar47);
          desret_xmlNodePtr(pxVar45);
          call_tests = call_tests + 1;
          des_xmlNodePtr(uVar51,pxVar33,nr_13);
          if (uVar58 == 0) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewTextChild",(ulong)(uint)(iVar2 - iVar1));
            test_ret = test_ret + 1;
            printf(" %d",(ulong)uVar51);
            printf(" %d",(ulong)uVar58);
            printf(" %d",uVar42);
            printf(" %d");
            putchar(10);
            pxVar33 = pxVar44;
          }
          uVar61 = uVar61 + 1;
          pxVar44 = (xmlNodePtr)(ulong)uVar61;
          puVar64 = puVar64 + 1;
        } while (uVar61 != 5);
        uVar61 = (uint)uVar42 + 1;
        uVar42 = (ulong)uVar61;
      } while (uVar61 != 5);
      bVar66 = uVar58 == 0;
      uVar58 = uVar58 + 1;
    } while (bVar66);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar1 = 0;
  uVar42 = 0;
  do {
    puVar63 = &DAT_0015fd28;
    uVar51 = 0;
    do {
      iVar2 = xmlMemBlocks();
      switch(uVar42) {
      case 0:
        bVar66 = false;
        pcVar62 = "foo";
        break;
      case 1:
        bVar66 = false;
        pcVar62 = "<foo/>";
        break;
      case 2:
        bVar66 = false;
        pcVar62 = anon_var_dwarf_1b8;
        break;
      case 3:
        bVar66 = false;
        pcVar62 = " 2ab ";
        break;
      default:
        bVar66 = true;
        pcVar62 = (char *)0x0;
      }
      uVar58 = 0xffffffff;
      if (uVar51 < 4) {
        uVar58 = *puVar63;
      }
      if ((bVar66) || (sVar38 = strlen(pcVar62), (int)uVar58 <= (int)sVar38 + 1)) {
        pxVar33 = (xmlNodePtr)(ulong)uVar58;
        pxVar44 = (xmlNodePtr)xmlNewTextLen(pcVar62);
        desret_xmlNodePtr(pxVar44);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar2 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewTextLen",(ulong)(uint)(iVar3 - iVar2));
          iVar1 = iVar1 + 1;
          printf(" %d",uVar42);
          pxVar33 = (xmlNodePtr)(ulong)uVar51;
          printf(" %d");
          putchar(10);
        }
      }
      uVar51 = uVar51 + 1;
      puVar63 = puVar63 + 1;
    } while (uVar51 != 4);
    uVar51 = (int)uVar42 + 1;
    uVar42 = (ulong)uVar51;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  uVar51 = 0;
  iVar2 = 0;
  do {
    iVar4 = (int)pxVar33;
    iVar3 = xmlMemBlocks();
    pxVar33 = gen_xmlNodePtr(uVar51,iVar4);
    pxVar44 = (xmlNodePtr)xmlNextElementSibling(pxVar33);
    desret_xmlNodePtr(pxVar44);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar51,pxVar33,nr_14);
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNextElementSibling",(ulong)(uint)(iVar4 - iVar3));
      iVar2 = iVar2 + 1;
      pxVar33 = (xmlNodePtr)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  iVar26 = iVar26 + iVar7 + iVar8 + test_ret;
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar51 = 0;
  do {
    puVar64 = &DAT_00162d68;
    pxVar44 = (xmlNodePtr)0x0;
    do {
      iVar5 = (int)pxVar33;
      iVar4 = xmlMemBlocks();
      pxVar33 = gen_xmlNodePtr(uVar51,iVar5);
      uVar58 = (uint)pxVar44;
      if (uVar58 < 4) {
        uVar39 = *puVar64;
      }
      else {
        uVar39 = 0;
      }
      xmlNodeAddContent(pxVar33,uVar39);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar51,pxVar33,nr_15);
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeAddContent",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d");
        putchar(10);
        pxVar33 = pxVar44;
      }
      uVar58 = uVar58 + 1;
      pxVar44 = (xmlNodePtr)(ulong)uVar58;
      puVar64 = puVar64 + 1;
    } while (uVar58 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar4 = 0;
  iVar5 = 0;
  do {
    uVar42 = 0;
    do {
      pxVar44 = (xmlNodePtr)0x0;
      piVar65 = &DAT_0015fd28;
      do {
        iVar6 = xmlMemBlocks();
        pxVar45 = gen_xmlNodePtr(iVar5,(int)pxVar33);
        switch(uVar42) {
        case 0:
          bVar66 = false;
          pcVar62 = "foo";
          break;
        case 1:
          bVar66 = false;
          pcVar62 = "<foo/>";
          break;
        case 2:
          bVar66 = false;
          pcVar62 = anon_var_dwarf_1b8;
          break;
        case 3:
          bVar66 = false;
          pcVar62 = " 2ab ";
          break;
        default:
          bVar66 = true;
          pcVar62 = (char *)0x0;
        }
        iVar7 = -1;
        uVar51 = (uint)pxVar44;
        if (uVar51 < 4) {
          iVar7 = *piVar65;
        }
        if ((bVar66) || (sVar38 = strlen(pcVar62), iVar7 <= (int)sVar38 + 1)) {
          xmlNodeAddContentLen(pxVar45,pcVar62,iVar7);
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar5,pxVar45,nr_16);
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          pxVar33 = pxVar45;
          if (iVar6 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNodeAddContentLen",(ulong)(uint)(iVar7 - iVar6));
            iVar4 = iVar4 + 1;
            printf(" %d",iVar5);
            printf(" %d",uVar42);
            printf(" %d");
            putchar(10);
            pxVar33 = pxVar44;
          }
        }
        uVar51 = uVar51 + 1;
        pxVar44 = (xmlNodePtr)(ulong)uVar51;
        piVar65 = piVar65 + 1;
      } while (uVar51 != 4);
      uVar51 = (int)uVar42 + 1;
      uVar42 = (ulong)uVar51;
    } while (uVar51 != 5);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 3);
  function_tests = function_tests + 1;
  test_ret_17 = 0;
  iVar5 = 0;
  do {
    iVar7 = (int)pxVar33;
    iVar6 = xmlMemBlocks();
    pxVar34 = gen_xmlBufferPtr(iVar5,iVar7);
    pxVar33 = (xmlNodePtr)0x0;
    xmlNodeBufGetContent(pxVar34);
    call_tests = call_tests + 1;
    if (pxVar34 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar34);
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNodeBufGetContent",(ulong)(uint)(iVar7 - iVar6));
      test_ret_17 = test_ret_17 + 1;
      printf(" %d");
      pxVar33 = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 != 3);
  function_tests = function_tests + 1;
  test_ret_18 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      uVar61 = 0;
      do {
        uVar60 = 0;
        do {
          pxVar44 = (xmlNodePtr)0x0;
          puVar48 = &DAT_0015fd28;
          do {
            iVar6 = (int)pxVar33;
            iVar5 = xmlMemBlocks();
            pxVar34 = gen_xmlBufferPtr(uVar51,iVar6);
            pxVar55 = gen_xmlDocPtr(uVar58,iVar6);
            pxVar33 = gen_xmlNodePtr(uVar61,iVar6);
            uVar57 = 0xffffffff;
            uVar54 = 0xffffffff;
            if (uVar60 < 4) {
              uVar54 = (&DAT_0015fd28)[uVar60];
            }
            uVar53 = (uint)pxVar44;
            if (uVar53 < 4) {
              uVar57 = *puVar48;
            }
            xmlNodeDump(pxVar34,pxVar55,pxVar33,uVar54,uVar57);
            call_tests = call_tests + 1;
            iVar6 = extraout_EDX_21;
            if (pxVar34 != (xmlBufferPtr)0x0) {
              xmlBufferFree(pxVar34);
              iVar6 = extraout_EDX_22;
            }
            if (((pxVar55 != (xmlDocPtr)0x0) && (api_doc != pxVar55)) && (pxVar55->doc != api_doc))
            {
              xmlFreeDoc(pxVar55);
              iVar6 = extraout_EDX_23;
            }
            des_xmlNodePtr(uVar61,pxVar33,iVar6);
            xmlResetLastError();
            iVar6 = xmlMemBlocks();
            if (iVar5 != iVar6) {
              iVar6 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlNodeDump",(ulong)(uint)(iVar6 - iVar5));
              test_ret_18 = test_ret_18 + 1;
              printf(" %d",(ulong)uVar51);
              printf(" %d",(ulong)uVar58);
              printf(" %d",(ulong)uVar61);
              printf(" %d",(ulong)uVar60);
              printf(" %d");
              putchar(10);
              pxVar33 = pxVar44;
            }
            uVar53 = uVar53 + 1;
            pxVar44 = (xmlNodePtr)(ulong)uVar53;
            puVar48 = puVar48 + 1;
          } while (uVar53 != 4);
          uVar60 = uVar60 + 1;
        } while (uVar60 != 4);
        uVar61 = uVar61 + 1;
      } while (uVar61 != 3);
      uVar58 = uVar58 + 1;
    } while (uVar58 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  _test_ret_16 = &DAT_0015fd28;
  iVar5 = 0;
  _test_ret_3 = 0;
  do {
    uVar51 = 0;
    do {
      uVar58 = 0;
      do {
        uVar61 = 0;
        do {
          uVar60 = 0;
          do {
            puVar64 = &DAT_00162d50;
            pxVar44 = (xmlNodePtr)0x0;
            do {
              iVar7 = (int)pxVar33;
              iVar6 = xmlMemBlocks();
              if (test_ret_3 == 0) {
                iVar7 = 0;
                lVar37 = xmlOutputBufferCreateFilename("test.out",0,0);
              }
              else {
                lVar37 = 0;
              }
              pxVar55 = gen_xmlDocPtr(uVar51,iVar7);
              pxVar33 = gen_xmlNodePtr(uVar58,iVar7);
              uVar57 = 0xffffffff;
              uVar54 = 0xffffffff;
              if (uVar61 < 4) {
                uVar54 = (&DAT_0015fd28)[uVar61];
              }
              if (uVar60 < 4) {
                uVar57 = (&DAT_0015fd28)[uVar60];
              }
              uVar53 = (uint)pxVar44;
              if (uVar53 < 3) {
                uVar39 = *puVar64;
              }
              else {
                uVar39 = 0;
              }
              xmlNodeDumpOutput(lVar37,pxVar55,pxVar33,uVar54,uVar57,uVar39);
              call_tests = call_tests + 1;
              iVar7 = extraout_EDX_24;
              if (lVar37 != 0) {
                xmlOutputBufferClose(lVar37);
                iVar7 = extraout_EDX_25;
              }
              if (((pxVar55 != (xmlDocPtr)0x0) && (api_doc != pxVar55)) && (pxVar55->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar55);
                iVar7 = extraout_EDX_26;
              }
              des_xmlNodePtr(uVar58,pxVar33,iVar7);
              xmlResetLastError();
              iVar7 = xmlMemBlocks();
              if (iVar6 != iVar7) {
                iVar7 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlNodeDumpOutput",(ulong)(uint)(iVar7 - iVar6));
                iVar5 = iVar5 + 1;
                printf(" %d",_test_ret_3);
                printf(" %d",(ulong)uVar51);
                printf(" %d",(ulong)uVar58);
                printf(" %d",(ulong)uVar61);
                printf(" %d",(ulong)uVar60);
                printf(" %d");
                putchar(10);
                pxVar33 = pxVar44;
              }
              uVar53 = uVar53 + 1;
              pxVar44 = (xmlNodePtr)(ulong)uVar53;
              puVar64 = puVar64 + 1;
            } while (uVar53 != 4);
            uVar60 = uVar60 + 1;
          } while (uVar60 != 4);
          uVar61 = uVar61 + 1;
        } while (uVar61 != 4);
        uVar58 = uVar58 + 1;
      } while (uVar58 != 3);
      uVar51 = uVar51 + 1;
    } while (uVar51 != 4);
    bVar66 = test_ret_3 == 0;
    _test_ret_3 = (ulong)(test_ret_3 + 1);
  } while (bVar66);
  function_tests = function_tests + 1;
  iVar6 = xmlMemBlocks();
  lVar37 = xmlNodeGetBase(0);
  if (lVar37 != 0) {
    (*_xmlFree)(lVar37);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar7 = xmlMemBlocks();
  if (iVar6 != iVar7) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNodeGetBase");
    printf(" %d");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar8 = xmlMemBlocks();
  lVar37 = xmlNodeGetContent(0);
  if (lVar37 != 0) {
    (*_xmlFree)(lVar37);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar9 = xmlMemBlocks();
  if (iVar8 != iVar9) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNodeGetContent");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar10 = xmlMemBlocks();
  lVar37 = xmlNodeGetLang(0);
  if (lVar37 != 0) {
    (*_xmlFree)(lVar37);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar11 = xmlMemBlocks();
  if (iVar10 != iVar11) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNodeGetLang");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar27 = xmlMemBlocks();
  xmlNodeGetSpacePreserve(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar52 = xmlMemBlocks();
  if (iVar27 != iVar52) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNodeGetSpacePreserve");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar12 = xmlMemBlocks();
  xmlNodeIsText(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar13 = xmlMemBlocks();
  if (iVar12 != iVar13) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNodeIsText");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar51 = 0;
  test_ret = 0;
  do {
    iVar14 = xmlMemBlocks();
    uVar54 = 0xffffffff;
    if (uVar51 < 4) {
      uVar54 = *_test_ret_16;
    }
    pxVar55 = (xmlDocPtr)0x0;
    lVar37 = xmlNodeListGetRawString(0,0,uVar54);
    if (lVar37 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar15 = xmlMemBlocks();
    if (iVar14 != iVar15) {
      iVar15 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNodeListGetRawString",(ulong)(uint)(iVar15 - iVar14));
      test_ret = test_ret + 1;
      printf(" %d",0);
      printf(" %d",0);
      pxVar55 = (xmlDocPtr)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
    _test_ret_16 = _test_ret_16 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  uVar51 = 0;
  do {
    puVar48 = &DAT_0015fd28;
    pxVar35 = (xmlDocPtr)0x0;
    do {
      iVar15 = (int)pxVar55;
      iVar14 = xmlMemBlocks();
      pxVar40 = gen_xmlDocPtr(uVar51,iVar15);
      uVar54 = 0xffffffff;
      uVar58 = (uint)pxVar35;
      if (uVar58 < 4) {
        uVar54 = *puVar48;
      }
      pxVar55 = (xmlDocPtr)0x0;
      lVar37 = xmlNodeListGetString(pxVar40,0,uVar54);
      if (lVar37 != 0) {
        (*_xmlFree)(lVar37);
      }
      call_tests = call_tests + 1;
      if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
        xmlFreeDoc(pxVar40);
      }
      xmlResetLastError();
      iVar15 = xmlMemBlocks();
      if (iVar14 != iVar15) {
        iVar15 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeListGetString",(ulong)(uint)(iVar15 - iVar14));
        test_ret_1 = test_ret_1 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        pxVar55 = pxVar35;
      }
      uVar58 = uVar58 + 1;
      pxVar35 = (xmlDocPtr)(ulong)uVar58;
      puVar48 = puVar48 + 1;
    } while (uVar58 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  iVar14 = 0;
  uVar51 = 0;
  do {
    puVar64 = &DAT_00162d68;
    pxVar35 = (xmlDocPtr)0x0;
    do {
      iVar16 = (int)pxVar55;
      iVar15 = xmlMemBlocks();
      pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar51,iVar16);
      uVar58 = (uint)pxVar35;
      if (uVar58 < 4) {
        uVar39 = *puVar64;
      }
      else {
        uVar39 = 0;
      }
      xmlNodeSetBase(pxVar55,uVar39);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar51,(xmlNodePtr)pxVar55,nr_17);
      xmlResetLastError();
      iVar16 = xmlMemBlocks();
      if (iVar15 != iVar16) {
        iVar16 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetBase",(ulong)(uint)(iVar16 - iVar15));
        iVar14 = iVar14 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d");
        putchar(10);
        pxVar55 = pxVar35;
      }
      uVar58 = uVar58 + 1;
      pxVar35 = (xmlDocPtr)(ulong)uVar58;
      puVar64 = puVar64 + 1;
    } while (uVar58 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  iVar26 = iVar26 + iVar1 + iVar2 + iVar3 + iVar4 + test_ret_17 + test_ret_18 + iVar5 +
           (uint)(iVar6 != iVar7) + (uint)(iVar8 != iVar9) + (uint)(iVar10 != iVar11) +
           (uint)(iVar27 != iVar52) + (uint)(iVar12 != iVar13) + test_ret;
  function_tests = function_tests + 1;
  iVar1 = 0;
  uVar51 = 0;
  do {
    puVar64 = &DAT_00162d68;
    pxVar35 = (xmlDocPtr)0x0;
    do {
      iVar3 = (int)pxVar55;
      iVar2 = xmlMemBlocks();
      pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar51,iVar3);
      uVar58 = (uint)pxVar35;
      if (uVar58 < 4) {
        uVar39 = *puVar64;
      }
      else {
        uVar39 = 0;
      }
      xmlNodeSetContent(pxVar55,uVar39);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar51,(xmlNodePtr)pxVar55,nr_18);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetContent",(ulong)(uint)(iVar3 - iVar2));
        iVar1 = iVar1 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d");
        putchar(10);
        pxVar55 = pxVar35;
      }
      uVar58 = uVar58 + 1;
      pxVar35 = (xmlDocPtr)(ulong)uVar58;
      puVar64 = puVar64 + 1;
    } while (uVar58 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  iVar2 = 0;
  do {
    uVar42 = 0;
    do {
      pxVar35 = (xmlDocPtr)0x0;
      piVar65 = &DAT_0015fd28;
      do {
        iVar3 = xmlMemBlocks();
        pxVar40 = (xmlDocPtr)gen_xmlNodePtr(iVar2,(int)pxVar55);
        switch(uVar42) {
        case 0:
          bVar66 = false;
          pcVar62 = "foo";
          break;
        case 1:
          bVar66 = false;
          pcVar62 = "<foo/>";
          break;
        case 2:
          bVar66 = false;
          pcVar62 = anon_var_dwarf_1b8;
          break;
        case 3:
          bVar66 = false;
          pcVar62 = " 2ab ";
          break;
        default:
          bVar66 = true;
          pcVar62 = (char *)0x0;
        }
        iVar4 = -1;
        uVar51 = (uint)pxVar35;
        if (uVar51 < 4) {
          iVar4 = *piVar65;
        }
        if ((bVar66) || (sVar38 = strlen(pcVar62), iVar4 <= (int)sVar38 + 1)) {
          xmlNodeSetContentLen(pxVar40,pcVar62,iVar4);
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar2,(xmlNodePtr)pxVar40,nr_19);
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          pxVar55 = pxVar40;
          if (iVar3 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNodeSetContentLen",(ulong)(uint)(iVar4 - iVar3));
            test_ret_2 = test_ret_2 + 1;
            printf(" %d",iVar2);
            printf(" %d",uVar42);
            printf(" %d");
            putchar(10);
            pxVar55 = pxVar35;
          }
        }
        uVar51 = uVar51 + 1;
        pxVar35 = (xmlDocPtr)(ulong)uVar51;
        piVar65 = piVar65 + 1;
      } while (uVar51 != 4);
      uVar51 = (int)uVar42 + 1;
      uVar42 = (ulong)uVar51;
    } while (uVar51 != 5);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 3);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar51 = 0;
  do {
    puVar64 = &DAT_00162d68;
    pxVar35 = (xmlDocPtr)0x0;
    do {
      iVar4 = (int)pxVar55;
      iVar3 = xmlMemBlocks();
      pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar51,iVar4);
      uVar58 = (uint)pxVar35;
      if (uVar58 < 4) {
        uVar39 = *puVar64;
      }
      else {
        uVar39 = 0;
      }
      xmlNodeSetLang(pxVar55,uVar39);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar51,(xmlNodePtr)pxVar55,nr_20);
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetLang",(ulong)(uint)(iVar4 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d");
        putchar(10);
        pxVar55 = pxVar35;
      }
      uVar58 = uVar58 + 1;
      pxVar35 = (xmlDocPtr)(ulong)uVar58;
      puVar64 = puVar64 + 1;
    } while (uVar58 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar51 = 0;
  do {
    puVar64 = &DAT_00162d68;
    pxVar35 = (xmlDocPtr)0x0;
    do {
      iVar5 = (int)pxVar55;
      iVar4 = xmlMemBlocks();
      pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar51,iVar5);
      uVar58 = (uint)pxVar35;
      if (uVar58 < 4) {
        uVar39 = *puVar64;
      }
      else {
        uVar39 = 0;
      }
      xmlNodeSetName(pxVar55,uVar39);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar51,(xmlNodePtr)pxVar55,nr_21);
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetName",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d");
        putchar(10);
        pxVar55 = pxVar35;
      }
      uVar58 = uVar58 + 1;
      pxVar35 = (xmlDocPtr)(ulong)uVar58;
      puVar64 = puVar64 + 1;
    } while (uVar58 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar51 = 0;
  do {
    puVar48 = &DAT_0015fd28;
    pxVar35 = (xmlDocPtr)0x0;
    do {
      iVar6 = (int)pxVar55;
      iVar5 = xmlMemBlocks();
      pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar51,iVar6);
      uVar54 = 0xffffffff;
      uVar58 = (uint)pxVar35;
      if (uVar58 < 4) {
        uVar54 = *puVar48;
      }
      xmlNodeSetSpacePreserve(pxVar55,uVar54);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar51,(xmlNodePtr)pxVar55,nr_22);
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetSpacePreserve",(ulong)(uint)(iVar6 - iVar5));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d");
        putchar(10);
        pxVar55 = pxVar35;
      }
      uVar58 = uVar58 + 1;
      pxVar35 = (xmlDocPtr)(ulong)uVar58;
      puVar48 = puVar48 + 1;
    } while (uVar58 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  uVar51 = 0;
  iVar5 = 0;
  do {
    iVar7 = (int)pxVar55;
    iVar6 = xmlMemBlocks();
    pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar51,iVar7);
    pxVar33 = (xmlNodePtr)xmlPreviousElementSibling(pxVar55);
    desret_xmlNodePtr(pxVar33);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar51,(xmlNodePtr)pxVar55,nr_23);
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPreviousElementSibling",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      iVar7 = (int)pxVar55;
      iVar8 = xmlMemBlocks();
      pxVar35 = gen_xmlDocPtr(uVar51,iVar7);
      pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar58,iVar7);
      xmlReconciliateNs(pxVar35,pxVar55);
      call_tests = call_tests + 1;
      iVar7 = extraout_EDX_27;
      if (((pxVar35 != (xmlDocPtr)0x0) && (api_doc != pxVar35)) && (pxVar35->doc != api_doc)) {
        xmlFreeDoc(pxVar35);
        iVar7 = extraout_EDX_28;
      }
      des_xmlNodePtr(uVar58,(xmlNodePtr)pxVar55,iVar7);
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar8 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlReconciliateNs",(ulong)(uint)(iVar7 - iVar8));
        iVar6 = iVar6 + 1;
        printf(" %d",(ulong)uVar51);
        pxVar55 = (xmlDocPtr)(ulong)uVar58;
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
    } while (uVar58 != 3);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  uVar51 = 0;
  iVar7 = 0;
  do {
    iVar8 = xmlMemBlocks();
    pxVar36 = gen_xmlAttrPtr(uVar51,(int)pxVar55);
    xmlRemoveProp(pxVar36);
    call_tests = call_tests + 1;
    if (uVar51 == 0) {
      xmlFreeDoc(api_doc);
      api_doc = (xmlDocPtr)0x0;
      api_dtd = (xmlDtdPtr)0x0;
      api_root = (xmlNodePtr)0x0;
      api_ns = (xmlNsPtr)0x0;
    }
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRemoveProp",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
  } while (uVar51 == 1);
  function_tests = function_tests + 1;
  uVar51 = 0;
  iVar8 = 0;
  do {
    uVar58 = 0;
    do {
      iVar10 = (int)pxVar55;
      iVar9 = xmlMemBlocks();
      pxVar33 = gen_xmlNodePtr(uVar51,iVar10);
      if (uVar58 == 0) {
        pxVar35 = (xmlDocPtr)xmlNewPI("test",0);
      }
      else {
        pxVar35 = (xmlDocPtr)0x0;
      }
      pxVar55 = pxVar35;
      xmlReplaceNode(pxVar33);
      if (pxVar35 != (xmlDocPtr)0x0) {
        xmlUnlinkNode(pxVar35);
        xmlFreeNode(pxVar35);
      }
      if (pxVar33 != (xmlNodePtr)0x0) {
        xmlUnlinkNode(pxVar33);
        xmlFreeNode(pxVar33);
      }
      call_tests = call_tests + 1;
      if (uVar51 == 1) {
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar9 != iVar10) {
        iVar10 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlReplaceNode",(ulong)(uint)(iVar10 - iVar9));
        iVar8 = iVar8 + 1;
        printf(" %d",(ulong)uVar51);
        pxVar55 = (xmlDocPtr)(ulong)uVar58;
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
    } while (uVar58 != 3);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar9 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      iVar11 = (int)pxVar55;
      iVar10 = xmlMemBlocks();
      if (uVar51 < 5) {
        puVar50 = (&PTR_anon_var_dwarf_62f_00162d28)[uVar51];
      }
      else {
        puVar50 = (undefined *)0x0;
      }
      pxVar35 = gen_xmlDocPtr(uVar58,iVar11);
      pxVar55 = pxVar35;
      xmlSaveFile(puVar50);
      call_tests = call_tests + 1;
      if (((pxVar35 != (xmlDocPtr)0x0) && (api_doc != pxVar35)) && (pxVar35->doc != api_doc)) {
        xmlFreeDoc(pxVar35);
      }
      xmlResetLastError();
      iVar11 = xmlMemBlocks();
      if (iVar10 != iVar11) {
        iVar11 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSaveFile",(ulong)(uint)(iVar11 - iVar10));
        iVar9 = iVar9 + 1;
        printf(" %d",(ulong)uVar51);
        pxVar55 = (xmlDocPtr)(ulong)uVar58;
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
    } while (uVar58 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 6);
  function_tests = function_tests + 1;
  iVar10 = 0;
  uVar42 = 0;
  do {
    uVar51 = 0;
    do {
      pxVar35 = (xmlDocPtr)0x0;
      puVar64 = &DAT_00162d50;
      do {
        iVar27 = (int)pxVar55;
        iVar11 = xmlMemBlocks();
        if ((uint)uVar42 < 5) {
          puVar50 = (&PTR_anon_var_dwarf_62f_00162d28)[uVar42];
        }
        else {
          puVar50 = (undefined *)0x0;
        }
        pxVar40 = gen_xmlDocPtr(uVar51,iVar27);
        uVar58 = (uint)pxVar35;
        if (uVar58 < 3) {
          uVar39 = *puVar64;
        }
        else {
          uVar39 = 0;
        }
        pxVar55 = pxVar40;
        xmlSaveFileEnc(puVar50,pxVar40,uVar39);
        call_tests = call_tests + 1;
        if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
          xmlFreeDoc(pxVar40);
        }
        xmlResetLastError();
        iVar27 = xmlMemBlocks();
        if (iVar11 != iVar27) {
          iVar27 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSaveFileEnc",(ulong)(uint)(iVar27 - iVar11));
          iVar10 = iVar10 + 1;
          printf(" %d",uVar42);
          printf(" %d",(ulong)uVar51);
          printf(" %d");
          putchar(10);
          pxVar55 = pxVar35;
        }
        uVar58 = uVar58 + 1;
        pxVar35 = (xmlDocPtr)(ulong)uVar58;
        puVar64 = puVar64 + 1;
      } while (uVar58 != 4);
      uVar51 = uVar51 + 1;
    } while (uVar51 != 4);
    uVar51 = (uint)uVar42 + 1;
    uVar42 = (ulong)uVar51;
  } while (uVar51 != 6);
  function_tests = function_tests + 1;
  iVar11 = 0;
  _test_ret = 0;
  do {
    uVar51 = 0;
    do {
      pxVar35 = (xmlDocPtr)0x0;
      puVar64 = &DAT_00162d50;
      do {
        iVar52 = (int)pxVar55;
        iVar27 = xmlMemBlocks();
        if (test_ret == 0) {
          iVar52 = 0;
          uVar39 = xmlOutputBufferCreateFilename("test.out",0,0);
        }
        else {
          uVar39 = 0;
        }
        pxVar40 = gen_xmlDocPtr(uVar51,iVar52);
        uVar58 = (uint)pxVar35;
        if (uVar58 < 3) {
          uVar47 = *puVar64;
        }
        else {
          uVar47 = 0;
        }
        pxVar55 = pxVar40;
        xmlSaveFileTo(uVar39,pxVar40,uVar47);
        call_tests = call_tests + 1;
        if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
          xmlFreeDoc(pxVar40);
        }
        xmlResetLastError();
        iVar52 = xmlMemBlocks();
        if (iVar27 != iVar52) {
          iVar52 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSaveFileTo",(ulong)(uint)(iVar52 - iVar27));
          iVar11 = iVar11 + 1;
          printf(" %d",_test_ret);
          printf(" %d",(ulong)uVar51);
          printf(" %d");
          putchar(10);
          pxVar55 = pxVar35;
        }
        uVar58 = uVar58 + 1;
        pxVar35 = (xmlDocPtr)(ulong)uVar58;
        puVar64 = puVar64 + 1;
      } while (uVar58 != 4);
      uVar51 = uVar51 + 1;
    } while (uVar51 != 4);
    bVar66 = test_ret == 0;
    _test_ret = (ulong)(test_ret + 1);
  } while (bVar66);
  function_tests = function_tests + 1;
  iVar27 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      pxVar35 = (xmlDocPtr)0x0;
      puVar48 = &DAT_0015fd28;
      do {
        iVar12 = (int)pxVar55;
        iVar52 = xmlMemBlocks();
        if (uVar51 < 5) {
          puVar50 = (&PTR_anon_var_dwarf_62f_00162d28)[uVar51];
        }
        else {
          puVar50 = (undefined *)0x0;
        }
        pxVar40 = gen_xmlDocPtr(uVar58,iVar12);
        uVar54 = 0xffffffff;
        uVar61 = (uint)pxVar35;
        if (uVar61 < 4) {
          uVar54 = *puVar48;
        }
        pxVar55 = pxVar40;
        xmlSaveFormatFile(puVar50,pxVar40,uVar54);
        call_tests = call_tests + 1;
        if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
          xmlFreeDoc(pxVar40);
        }
        xmlResetLastError();
        iVar12 = xmlMemBlocks();
        if (iVar52 != iVar12) {
          iVar12 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSaveFormatFile",(ulong)(uint)(iVar12 - iVar52));
          iVar27 = iVar27 + 1;
          printf(" %d",(ulong)uVar51);
          printf(" %d",(ulong)uVar58);
          printf(" %d");
          putchar(10);
          pxVar55 = pxVar35;
        }
        uVar61 = uVar61 + 1;
        pxVar35 = (xmlDocPtr)(ulong)uVar61;
        puVar48 = puVar48 + 1;
      } while (uVar61 != 4);
      uVar58 = uVar58 + 1;
    } while (uVar58 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 6);
  function_tests = function_tests + 1;
  iVar52 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      uVar42 = 0;
      do {
        puVar48 = &DAT_0015fd28;
        pxVar35 = (xmlDocPtr)0x0;
        do {
          iVar13 = (int)pxVar55;
          iVar12 = xmlMemBlocks();
          if (uVar51 < 5) {
            puVar50 = (&PTR_anon_var_dwarf_62f_00162d28)[uVar51];
          }
          else {
            puVar50 = (undefined *)0x0;
          }
          pxVar40 = gen_xmlDocPtr(uVar58,iVar13);
          if ((uint)uVar42 < 3) {
            uVar39 = (&DAT_00162d50)[uVar42];
          }
          else {
            uVar39 = 0;
          }
          uVar54 = 0xffffffff;
          uVar61 = (uint)pxVar35;
          if (uVar61 < 4) {
            uVar54 = *puVar48;
          }
          pxVar55 = pxVar40;
          xmlSaveFormatFileEnc(puVar50,pxVar40,uVar39,uVar54);
          call_tests = call_tests + 1;
          if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
            xmlFreeDoc(pxVar40);
          }
          xmlResetLastError();
          iVar13 = xmlMemBlocks();
          if (iVar12 != iVar13) {
            iVar13 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSaveFormatFileEnc",(ulong)(uint)(iVar13 - iVar12))
            ;
            iVar52 = iVar52 + 1;
            printf(" %d",(ulong)uVar51);
            printf(" %d",(ulong)uVar58);
            printf(" %d",uVar42);
            printf(" %d");
            putchar(10);
            pxVar55 = pxVar35;
          }
          uVar61 = uVar61 + 1;
          pxVar35 = (xmlDocPtr)(ulong)uVar61;
          puVar48 = puVar48 + 1;
        } while (uVar61 != 4);
        uVar61 = (uint)uVar42 + 1;
        uVar42 = (ulong)uVar61;
      } while (uVar61 != 4);
      uVar58 = uVar58 + 1;
    } while (uVar58 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 6);
  function_tests = function_tests + 1;
  iVar12 = 0;
  _test_ret = 0;
  do {
    uVar51 = 0;
    do {
      uVar42 = 0;
      do {
        puVar48 = &DAT_0015fd28;
        pxVar35 = (xmlDocPtr)0x0;
        do {
          iVar15 = (int)pxVar55;
          iVar13 = xmlMemBlocks();
          if (test_ret == 0) {
            iVar15 = 0;
            uVar39 = xmlOutputBufferCreateFilename("test.out",0,0);
          }
          else {
            uVar39 = 0;
          }
          pxVar40 = gen_xmlDocPtr(uVar51,iVar15);
          if ((uint)uVar42 < 3) {
            uVar47 = (&DAT_00162d50)[uVar42];
          }
          else {
            uVar47 = 0;
          }
          uVar54 = 0xffffffff;
          uVar58 = (uint)pxVar35;
          if (uVar58 < 4) {
            uVar54 = *puVar48;
          }
          pxVar55 = pxVar40;
          xmlSaveFormatFileTo(uVar39,pxVar40,uVar47,uVar54);
          call_tests = call_tests + 1;
          if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
            xmlFreeDoc(pxVar40);
          }
          xmlResetLastError();
          iVar15 = xmlMemBlocks();
          if (iVar13 != iVar15) {
            iVar15 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSaveFormatFileTo",(ulong)(uint)(iVar15 - iVar13));
            iVar12 = iVar12 + 1;
            printf(" %d",_test_ret);
            printf(" %d",(ulong)uVar51);
            printf(" %d",uVar42);
            printf(" %d");
            putchar(10);
            pxVar55 = pxVar35;
          }
          uVar58 = uVar58 + 1;
          pxVar35 = (xmlDocPtr)(ulong)uVar58;
          puVar48 = puVar48 + 1;
        } while (uVar58 != 4);
        uVar58 = (uint)uVar42 + 1;
        uVar42 = (ulong)uVar58;
      } while (uVar58 != 4);
      uVar51 = uVar51 + 1;
    } while (uVar51 != 4);
    bVar66 = test_ret == 0;
    _test_ret = (ulong)(test_ret + 1);
  } while (bVar66);
  function_tests = function_tests + 1;
  test_ret = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      pxVar35 = (xmlDocPtr)0x0;
      puVar64 = &DAT_00162d68;
      do {
        iVar15 = (int)pxVar55;
        iVar13 = xmlMemBlocks();
        pxVar40 = gen_xmlDocPtr(uVar51,iVar15);
        pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar58,iVar15);
        uVar61 = (uint)pxVar35;
        if (uVar61 < 4) {
          uVar39 = *puVar64;
        }
        else {
          uVar39 = 0;
        }
        xmlSearchNs(pxVar40,pxVar55,uVar39);
        call_tests = call_tests + 1;
        iVar15 = extraout_EDX_29;
        if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
          xmlFreeDoc(pxVar40);
          iVar15 = extraout_EDX_30;
        }
        des_xmlNodePtr(uVar58,(xmlNodePtr)pxVar55,iVar15);
        xmlResetLastError();
        iVar15 = xmlMemBlocks();
        if (iVar13 != iVar15) {
          iVar15 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSearchNs",(ulong)(uint)(iVar15 - iVar13));
          test_ret = test_ret + 1;
          printf(" %d",(ulong)uVar51);
          printf(" %d",(ulong)uVar58);
          printf(" %d");
          putchar(10);
          pxVar55 = pxVar35;
        }
        uVar61 = uVar61 + 1;
        pxVar35 = (xmlDocPtr)(ulong)uVar61;
        puVar64 = puVar64 + 1;
      } while (uVar61 != 5);
      uVar58 = uVar58 + 1;
    } while (uVar58 != 3);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  iVar13 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      pxVar35 = (xmlDocPtr)0x0;
      puVar64 = &DAT_00162d68;
      do {
        iVar16 = (int)pxVar55;
        iVar15 = xmlMemBlocks();
        pxVar40 = gen_xmlDocPtr(uVar51,iVar16);
        pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar58,iVar16);
        uVar61 = (uint)pxVar35;
        if (uVar61 < 4) {
          uVar39 = *puVar64;
        }
        else {
          uVar39 = 0;
        }
        xmlSearchNsByHref(pxVar40,pxVar55,uVar39);
        call_tests = call_tests + 1;
        iVar16 = extraout_EDX_31;
        if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
          xmlFreeDoc(pxVar40);
          iVar16 = extraout_EDX_32;
        }
        des_xmlNodePtr(uVar58,(xmlNodePtr)pxVar55,iVar16);
        xmlResetLastError();
        iVar16 = xmlMemBlocks();
        if (iVar15 != iVar16) {
          iVar16 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSearchNsByHref",(ulong)(uint)(iVar16 - iVar15));
          iVar13 = iVar13 + 1;
          printf(" %d",(ulong)uVar51);
          printf(" %d",(ulong)uVar58);
          printf(" %d");
          putchar(10);
          pxVar55 = pxVar35;
        }
        uVar61 = uVar61 + 1;
        pxVar35 = (xmlDocPtr)(ulong)uVar61;
        puVar64 = puVar64 + 1;
      } while (uVar61 != 5);
      uVar58 = uVar58 + 1;
    } while (uVar58 != 3);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  uVar51 = 0xffffffff;
  iVar15 = 0;
  do {
    iVar16 = xmlMemBlocks();
    uVar54 = 0;
    if (uVar51 < 3) {
      uVar54 = (&DAT_001521f8)[uVar51];
    }
    uVar51 = uVar51 + 1;
    xmlSetBufferAllocationScheme(uVar54);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar17 = xmlMemBlocks();
    if (iVar16 != iVar17) {
      iVar17 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSetBufferAllocationScheme",
             (ulong)(uint)(iVar17 - iVar16));
      iVar15 = iVar15 + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
  } while (uVar51 != 3);
  iVar1 = iVar26 + test_ret_1 + iVar14 + iVar1 + test_ret_2 + iVar2 + iVar3 + iVar4 + iVar5 + iVar6
          + iVar7 + iVar8 + iVar9 + iVar10 + iVar11 + iVar27 + iVar52 + iVar12 + test_ret;
  function_tests = function_tests + 1;
  puVar48 = &DAT_0015fd28;
  uVar51 = 0;
  iVar26 = 0;
  do {
    iVar2 = xmlMemBlocks();
    uVar54 = 0xffffffff;
    if (uVar51 < 4) {
      uVar54 = *puVar48;
    }
    xmlSetCompressMode(uVar54);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSetCompressMode",(ulong)(uint)(iVar3 - iVar2));
      iVar26 = iVar26 + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
    puVar48 = puVar48 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar51 = 0;
  do {
    puVar63 = &DAT_0015fd28;
    pxVar35 = (xmlDocPtr)0x0;
    do {
      iVar4 = (int)pxVar55;
      iVar3 = xmlMemBlocks();
      pxVar40 = gen_xmlDocPtr(uVar51,iVar4);
      pxVar55 = (xmlDocPtr)0xffffffff;
      uVar58 = (uint)pxVar35;
      if (uVar58 < 4) {
        pxVar55 = (xmlDocPtr)(ulong)*puVar63;
      }
      xmlSetDocCompressMode(pxVar40);
      call_tests = call_tests + 1;
      if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
        xmlFreeDoc(pxVar40);
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSetDocCompressMode",(ulong)(uint)(iVar4 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d");
        putchar(10);
        pxVar55 = pxVar35;
      }
      uVar58 = uVar58 + 1;
      pxVar35 = (xmlDocPtr)(ulong)uVar58;
      puVar63 = puVar63 + 1;
    } while (uVar58 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      iVar5 = (int)pxVar55;
      iVar4 = xmlMemBlocks();
      pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar51,iVar5);
      if (uVar58 == 0) {
        get_api_root();
        if (api_root != (xmlNodePtr)0x0) {
          api_ns = api_root->nsDef;
        }
        xmlSetNs(pxVar55,api_ns);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar51,(xmlNodePtr)pxVar55,nr_25);
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      else {
        xmlSetNs(pxVar55,0);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar51,(xmlNodePtr)pxVar55,nr_24);
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSetNs",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar51);
        pxVar55 = (xmlDocPtr)(ulong)uVar58;
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
    } while (uVar58 == 1);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar4 = 0;
  iVar5 = 0;
  do {
    uVar51 = 0;
    do {
      uVar58 = 0;
      do {
        puVar64 = &DAT_00162d68;
        pxVar35 = (xmlDocPtr)0x0;
        do {
          iVar7 = (int)pxVar55;
          iVar6 = xmlMemBlocks();
          pxVar55 = (xmlDocPtr)gen_xmlNodePtr(iVar5,iVar7);
          if (uVar51 == 0) {
            get_api_root();
            pxVar49 = api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              pxVar49 = api_root->nsDef;
              api_ns = pxVar49;
            }
          }
          else {
            pxVar49 = (xmlNs *)0x0;
          }
          if (uVar58 < 4) {
            uVar39 = (&DAT_00162d68)[uVar58];
          }
          else {
            uVar39 = 0;
          }
          uVar61 = (uint)pxVar35;
          if (uVar61 < 4) {
            uVar47 = *puVar64;
          }
          else {
            uVar47 = 0;
          }
          auVar67 = xmlSetNsProp(pxVar55,pxVar49,uVar39,uVar47);
          iVar7 = auVar67._8_4_;
          lVar37 = auVar67._0_8_;
          if (lVar37 != 0) {
            xmlUnlinkNode(lVar37);
            xmlFreeNode(lVar37);
            iVar7 = extraout_EDX_33;
          }
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar5,(xmlNodePtr)pxVar55,iVar7);
          if (uVar51 == 0) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar6 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSetNsProp",(ulong)(uint)(iVar7 - iVar6));
            iVar4 = iVar4 + 1;
            printf(" %d",iVar5);
            printf(" %d",(ulong)uVar51);
            printf(" %d",(ulong)uVar58);
            printf(" %d");
            putchar(10);
            pxVar55 = pxVar35;
          }
          uVar61 = uVar61 + 1;
          pxVar35 = (xmlDocPtr)(ulong)uVar61;
          puVar64 = puVar64 + 1;
        } while (uVar61 != 5);
        uVar58 = uVar58 + 1;
      } while (uVar58 != 5);
      bVar66 = uVar51 == 0;
      uVar51 = uVar51 + 1;
    } while (bVar66);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 3);
  function_tests = function_tests + 1;
  test_ret = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      pxVar35 = (xmlDocPtr)0x0;
      puVar64 = &DAT_00162d68;
      do {
        iVar6 = (int)pxVar55;
        iVar5 = xmlMemBlocks();
        pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar51,iVar6);
        if (uVar58 < 4) {
          uVar39 = (&DAT_00162d68)[uVar58];
        }
        else {
          uVar39 = 0;
        }
        uVar61 = (uint)pxVar35;
        if (uVar61 < 4) {
          uVar47 = *puVar64;
        }
        else {
          uVar47 = 0;
        }
        auVar67 = xmlSetProp(pxVar55,uVar39,uVar47);
        iVar6 = auVar67._8_4_;
        lVar37 = auVar67._0_8_;
        if (lVar37 != 0) {
          xmlUnlinkNode(lVar37);
          xmlFreeNode(lVar37);
          iVar6 = extraout_EDX_34;
        }
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar51,(xmlNodePtr)pxVar55,iVar6);
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSetProp",(ulong)(uint)(iVar6 - iVar5));
          test_ret = test_ret + 1;
          printf(" %d",(ulong)uVar51);
          printf(" %d",(ulong)uVar58);
          printf(" %d");
          putchar(10);
          pxVar55 = pxVar35;
        }
        uVar61 = uVar61 + 1;
        pxVar35 = (xmlDocPtr)(ulong)uVar61;
        puVar64 = puVar64 + 1;
      } while (uVar61 != 5);
      uVar58 = uVar58 + 1;
    } while (uVar58 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  puVar64 = &DAT_00162d68;
  iVar5 = 0;
  uVar51 = 0;
  do {
    iVar6 = xmlMemBlocks();
    if (uVar51 < 4) {
      uVar39 = *puVar64;
    }
    else {
      uVar39 = 0;
    }
    lVar37 = xmlSplitQName2(uVar39,0);
    if (lVar37 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSplitQName2",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
    puVar64 = puVar64 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  puVar64 = &DAT_00162d68;
  iVar6 = 0;
  uVar51 = 0;
  do {
    iVar7 = 0;
    do {
      iVar8 = xmlMemBlocks();
      if (uVar51 < 4) {
        uVar39 = (&DAT_00162d68)[uVar51];
      }
      else {
        uVar39 = 0;
      }
      xmlSplitQName3(uVar39);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSplitQName3",(ulong)(uint)(iVar9 - iVar8));
        iVar6 = iVar6 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d");
        putchar(10);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 == 1);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  uVar51 = 0;
  iVar7 = 0;
  do {
    iVar8 = xmlMemBlocks();
    if (uVar51 < 4) {
      pxVar33 = (xmlNodePtr)*puVar64;
    }
    else {
      pxVar33 = (xmlNodePtr)0x0;
    }
    pxVar44 = (xmlNodePtr)xmlStringGetNodeList(0);
    desret_xmlNodePtr(pxVar44);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlStringGetNodeList",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      printf(" %d",0);
      pxVar33 = (xmlNodePtr)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
    puVar64 = puVar64 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  iVar8 = 0;
  uVar51 = 0;
  do {
    piVar65 = &DAT_0015fd28;
    pxVar44 = (xmlNodePtr)0x0;
    do {
      iVar9 = xmlMemBlocks();
      switch(uVar51) {
      case 0:
        bVar66 = false;
        pcVar62 = "foo";
        break;
      case 1:
        bVar66 = false;
        pcVar62 = "<foo/>";
        break;
      case 2:
        bVar66 = false;
        pcVar62 = anon_var_dwarf_1b8;
        break;
      case 3:
        bVar66 = false;
        pcVar62 = " 2ab ";
        break;
      default:
        bVar66 = true;
        pcVar62 = (char *)0x0;
      }
      iVar10 = -1;
      uVar58 = (uint)pxVar44;
      if (uVar58 < 4) {
        iVar10 = *piVar65;
      }
      if ((bVar66) || (sVar38 = strlen(pcVar62), iVar10 <= (int)sVar38 + 1)) {
        pxVar33 = (xmlNodePtr)xmlStringLenGetNodeList(0,pcVar62,iVar10);
        desret_xmlNodePtr(pxVar33);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar10 = xmlMemBlocks();
        pxVar33 = (xmlNodePtr)pcVar62;
        if (iVar9 != iVar10) {
          iVar10 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlStringLenGetNodeList",(ulong)(uint)(iVar10 - iVar9))
          ;
          iVar8 = iVar8 + 1;
          printf(" %d",0);
          printf(" %d",(ulong)uVar51);
          printf(" %d");
          putchar(10);
          pxVar33 = pxVar44;
        }
      }
      uVar58 = uVar58 + 1;
      pxVar44 = (xmlNodePtr)(ulong)uVar58;
      piVar65 = piVar65 + 1;
    } while (uVar58 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  iVar9 = 0;
  iVar10 = 0;
  do {
    uVar42 = 0;
    do {
      pxVar44 = (xmlNodePtr)0x0;
      piVar65 = &DAT_0015fd28;
      do {
        iVar11 = xmlMemBlocks();
        pxVar45 = gen_xmlNodePtr(iVar10,(int)pxVar33);
        switch(uVar42) {
        case 0:
          bVar66 = false;
          pcVar62 = "foo";
          break;
        case 1:
          bVar66 = false;
          pcVar62 = "<foo/>";
          break;
        case 2:
          bVar66 = false;
          pcVar62 = anon_var_dwarf_1b8;
          break;
        case 3:
          bVar66 = false;
          pcVar62 = " 2ab ";
          break;
        default:
          bVar66 = true;
          pcVar62 = (char *)0x0;
        }
        iVar27 = -1;
        uVar51 = (uint)pxVar44;
        if (uVar51 < 4) {
          iVar27 = *piVar65;
        }
        if ((bVar66) || (sVar38 = strlen(pcVar62), iVar27 <= (int)sVar38 + 1)) {
          xmlTextConcat(pxVar45,pcVar62,iVar27);
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar10,pxVar45,nr_26);
          xmlResetLastError();
          iVar27 = xmlMemBlocks();
          pxVar33 = pxVar45;
          if (iVar11 != iVar27) {
            iVar27 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextConcat",(ulong)(uint)(iVar27 - iVar11));
            iVar9 = iVar9 + 1;
            printf(" %d",iVar10);
            printf(" %d",uVar42);
            printf(" %d");
            putchar(10);
            pxVar33 = pxVar44;
          }
        }
        uVar51 = uVar51 + 1;
        pxVar44 = (xmlNodePtr)(ulong)uVar51;
        piVar65 = piVar65 + 1;
      } while (uVar51 != 4);
      uVar51 = (int)uVar42 + 1;
      uVar42 = (ulong)uVar51;
    } while (uVar51 != 5);
    iVar10 = iVar10 + 1;
  } while (iVar10 != 3);
  function_tests = function_tests + 1;
  uVar51 = 0;
  iVar10 = 0;
  do {
    uVar58 = 0;
    do {
      iVar11 = xmlMemBlocks();
      if (uVar51 == 0) {
        lVar37 = xmlNewPI("test",0);
      }
      else {
        lVar37 = 0;
      }
      if (uVar58 == 0) {
        pxVar33 = (xmlNodePtr)xmlNewPI("test",0);
      }
      else {
        pxVar33 = (xmlNodePtr)0x0;
      }
      pxVar44 = pxVar33;
      pxVar45 = (xmlNodePtr)xmlTextMerge(lVar37);
      if ((lVar37 != 0) && (*(int *)(lVar37 + 8) != 3)) {
        xmlUnlinkNode(pxVar33);
        xmlFreeNode(pxVar33);
      }
      desret_xmlNodePtr(pxVar45);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar27 = xmlMemBlocks();
      if (iVar11 != iVar27) {
        iVar27 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlTextMerge",(ulong)(uint)(iVar27 - iVar11));
        iVar10 = iVar10 + 1;
        printf(" %d",(ulong)uVar51);
        pxVar44 = (xmlNodePtr)(ulong)uVar58;
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
    } while (uVar58 != 3);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar11 = 0;
  uVar51 = 0;
  do {
    uVar58 = 0;
    do {
      uVar61 = 0;
      puVar64 = &DAT_00162d68;
      do {
        iVar52 = (int)pxVar44;
        iVar27 = xmlMemBlocks();
        pxVar44 = gen_xmlNodePtr(uVar51,iVar52);
        if (uVar58 == 0) {
          get_api_root();
          pxVar49 = api_ns;
          if (api_root != (xmlNodePtr)0x0) {
            pxVar49 = api_root->nsDef;
            api_ns = pxVar49;
          }
        }
        else {
          pxVar49 = (xmlNs *)0x0;
        }
        if (uVar61 < 4) {
          uVar39 = *puVar64;
        }
        else {
          uVar39 = 0;
        }
        xmlUnsetNsProp(pxVar44,pxVar49,uVar39);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar51,pxVar44,nr_27);
        if (uVar58 == 0) {
          xmlFreeDoc(api_doc);
          api_doc = (xmlDocPtr)0x0;
          api_dtd = (xmlDtdPtr)0x0;
          api_root = (xmlNodePtr)0x0;
          api_ns = (xmlNsPtr)0x0;
        }
        xmlResetLastError();
        iVar52 = xmlMemBlocks();
        if (iVar27 != iVar52) {
          iVar52 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlUnsetNsProp",(ulong)(uint)(iVar52 - iVar27));
          iVar11 = iVar11 + 1;
          printf(" %d",(ulong)uVar51);
          printf(" %d",(ulong)uVar58);
          pxVar44 = (xmlNodePtr)(ulong)uVar61;
          printf(" %d");
          putchar(10);
        }
        uVar61 = uVar61 + 1;
        puVar64 = puVar64 + 1;
      } while (uVar61 != 5);
      bVar66 = uVar58 == 0;
      uVar58 = uVar58 + 1;
    } while (bVar66);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar27 = 0;
  uVar51 = 0;
  do {
    puVar64 = &DAT_00162d68;
    uVar58 = 0;
    do {
      iVar12 = (int)pxVar44;
      iVar52 = xmlMemBlocks();
      pxVar44 = gen_xmlNodePtr(uVar51,iVar12);
      if (uVar58 < 4) {
        uVar39 = *puVar64;
      }
      else {
        uVar39 = 0;
      }
      xmlUnsetProp(pxVar44,uVar39);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar51,pxVar44,nr_28);
      xmlResetLastError();
      iVar12 = xmlMemBlocks();
      if (iVar52 != iVar12) {
        iVar12 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlUnsetProp",(ulong)(uint)(iVar12 - iVar52));
        iVar27 = iVar27 + 1;
        printf(" %d",(ulong)uVar51);
        pxVar44 = (xmlNodePtr)(ulong)uVar58;
        printf(" %d");
        putchar(10);
      }
      uVar58 = uVar58 + 1;
      puVar64 = puVar64 + 1;
    } while (uVar58 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar52 = 0;
  uVar51 = 0;
  do {
    puVar48 = &DAT_0015fd28;
    uVar58 = 0;
    do {
      iVar12 = xmlMemBlocks();
      if (uVar51 < 4) {
        uVar39 = (&DAT_00162d68)[uVar51];
      }
      else {
        uVar39 = 0;
      }
      uVar54 = 0xffffffff;
      if (uVar58 < 4) {
        uVar54 = *puVar48;
      }
      xmlValidateNCName(uVar39,uVar54);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar14 = xmlMemBlocks();
      if (iVar12 != iVar14) {
        iVar14 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateNCName",(ulong)(uint)(iVar14 - iVar12));
        iVar52 = iVar52 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d",(ulong)uVar58);
        putchar(10);
      }
      uVar58 = uVar58 + 1;
      puVar48 = puVar48 + 1;
    } while (uVar58 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  iVar12 = 0;
  uVar51 = 0;
  do {
    puVar48 = &DAT_0015fd28;
    uVar58 = 0;
    do {
      iVar14 = xmlMemBlocks();
      if (uVar51 < 4) {
        uVar39 = (&DAT_00162d68)[uVar51];
      }
      else {
        uVar39 = 0;
      }
      uVar54 = 0xffffffff;
      if (uVar58 < 4) {
        uVar54 = *puVar48;
      }
      xmlValidateNMToken(uVar39,uVar54);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar16 = xmlMemBlocks();
      if (iVar14 != iVar16) {
        iVar16 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateNMToken",(ulong)(uint)(iVar16 - iVar14));
        iVar12 = iVar12 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d",(ulong)uVar58);
        putchar(10);
      }
      uVar58 = uVar58 + 1;
      puVar48 = puVar48 + 1;
    } while (uVar58 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  iVar14 = 0;
  uVar51 = 0;
  do {
    puVar48 = &DAT_0015fd28;
    uVar58 = 0;
    do {
      iVar16 = xmlMemBlocks();
      if (uVar51 < 4) {
        uVar39 = (&DAT_00162d68)[uVar51];
      }
      else {
        uVar39 = 0;
      }
      uVar54 = 0xffffffff;
      if (uVar58 < 4) {
        uVar54 = *puVar48;
      }
      xmlValidateName(uVar39,uVar54);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar17 = xmlMemBlocks();
      if (iVar16 != iVar17) {
        iVar17 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateName",(ulong)(uint)(iVar17 - iVar16));
        iVar14 = iVar14 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d",(ulong)uVar58);
        putchar(10);
      }
      uVar58 = uVar58 + 1;
      puVar48 = puVar48 + 1;
    } while (uVar58 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  iVar16 = 0;
  uVar51 = 0;
  do {
    puVar48 = &DAT_0015fd28;
    uVar58 = 0;
    do {
      iVar17 = xmlMemBlocks();
      if (uVar51 < 4) {
        uVar39 = (&DAT_00162d68)[uVar51];
      }
      else {
        uVar39 = 0;
      }
      uVar54 = 0xffffffff;
      if (uVar58 < 4) {
        uVar54 = *puVar48;
      }
      xmlValidateQName(uVar39,uVar54);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar18 = xmlMemBlocks();
      if (iVar17 != iVar18) {
        iVar18 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateQName",(ulong)(uint)(iVar18 - iVar17));
        iVar16 = iVar16 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d",(ulong)uVar58);
        putchar(10);
      }
      uVar58 = uVar58 + 1;
      puVar48 = puVar48 + 1;
    } while (uVar58 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  uVar51 = iVar1 + iVar13 + iVar15 + iVar26 + iVar2 + iVar3 + iVar4 + test_ret + iVar5 + iVar6 +
           iVar7 + iVar8 + iVar9 + iVar10 + iVar11 + iVar27 + iVar52 + iVar12 + iVar14 + iVar16;
  if (uVar51 != 0) {
    printf("Module tree: %d errors\n",(ulong)uVar51);
  }
  return uVar51;
}

Assistant:

static int
test_tree(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing tree : 142 of 164 functions ...\n");
    test_ret += test_xmlAddChild();
    test_ret += test_xmlAddChildList();
    test_ret += test_xmlAddNextSibling();
    test_ret += test_xmlAddPrevSibling();
    test_ret += test_xmlAddSibling();
    test_ret += test_xmlAttrSerializeTxtContent();
    test_ret += test_xmlBufContent();
    test_ret += test_xmlBufEnd();
    test_ret += test_xmlBufGetNodeContent();
    test_ret += test_xmlBufNodeDump();
    test_ret += test_xmlBufShrink();
    test_ret += test_xmlBufUse();
    test_ret += test_xmlBufferAdd();
    test_ret += test_xmlBufferAddHead();
    test_ret += test_xmlBufferCCat();
    test_ret += test_xmlBufferCat();
    test_ret += test_xmlBufferContent();
    test_ret += test_xmlBufferCreate();
    test_ret += test_xmlBufferCreateSize();
    test_ret += test_xmlBufferCreateStatic();
    test_ret += test_xmlBufferDetach();
    test_ret += test_xmlBufferEmpty();
    test_ret += test_xmlBufferGrow();
    test_ret += test_xmlBufferLength();
    test_ret += test_xmlBufferResize();
    test_ret += test_xmlBufferSetAllocationScheme();
    test_ret += test_xmlBufferShrink();
    test_ret += test_xmlBufferWriteCHAR();
    test_ret += test_xmlBufferWriteChar();
    test_ret += test_xmlBufferWriteQuotedString();
    test_ret += test_xmlBuildQName();
    test_ret += test_xmlChildElementCount();
    test_ret += test_xmlCopyDoc();
    test_ret += test_xmlCopyDtd();
    test_ret += test_xmlCopyNamespace();
    test_ret += test_xmlCopyNamespaceList();
    test_ret += test_xmlCopyNode();
    test_ret += test_xmlCopyNodeList();
    test_ret += test_xmlCopyProp();
    test_ret += test_xmlCopyPropList();
    test_ret += test_xmlCreateIntSubset();
    test_ret += test_xmlDOMWrapAdoptNode();
    test_ret += test_xmlDOMWrapCloneNode();
    test_ret += test_xmlDOMWrapNewCtxt();
    test_ret += test_xmlDOMWrapReconcileNamespaces();
    test_ret += test_xmlDOMWrapRemoveNode();
    test_ret += test_xmlDocCopyNode();
    test_ret += test_xmlDocCopyNodeList();
    test_ret += test_xmlDocDump();
    test_ret += test_xmlDocDumpFormatMemory();
    test_ret += test_xmlDocDumpFormatMemoryEnc();
    test_ret += test_xmlDocDumpMemory();
    test_ret += test_xmlDocDumpMemoryEnc();
    test_ret += test_xmlDocFormatDump();
    test_ret += test_xmlDocGetRootElement();
    test_ret += test_xmlDocSetRootElement();
    test_ret += test_xmlElemDump();
    test_ret += test_xmlFirstElementChild();
    test_ret += test_xmlGetBufferAllocationScheme();
    test_ret += test_xmlGetCompressMode();
    test_ret += test_xmlGetDocCompressMode();
    test_ret += test_xmlGetIntSubset();
    test_ret += test_xmlGetLastChild();
    test_ret += test_xmlGetLineNo();
    test_ret += test_xmlGetNoNsProp();
    test_ret += test_xmlGetNodePath();
    test_ret += test_xmlGetNsList();
    test_ret += test_xmlGetNsProp();
    test_ret += test_xmlGetProp();
    test_ret += test_xmlHasNsProp();
    test_ret += test_xmlHasProp();
    test_ret += test_xmlIsBlankNode();
    test_ret += test_xmlIsXHTML();
    test_ret += test_xmlLastElementChild();
    test_ret += test_xmlNewCDataBlock();
    test_ret += test_xmlNewCharRef();
    test_ret += test_xmlNewChild();
    test_ret += test_xmlNewComment();
    test_ret += test_xmlNewDoc();
    test_ret += test_xmlNewDocComment();
    test_ret += test_xmlNewDocFragment();
    test_ret += test_xmlNewDocNode();
    test_ret += test_xmlNewDocNodeEatName();
    test_ret += test_xmlNewDocPI();
    test_ret += test_xmlNewDocProp();
    test_ret += test_xmlNewDocRawNode();
    test_ret += test_xmlNewDocText();
    test_ret += test_xmlNewDocTextLen();
    test_ret += test_xmlNewDtd();
    test_ret += test_xmlNewNode();
    test_ret += test_xmlNewNodeEatName();
    test_ret += test_xmlNewNs();
    test_ret += test_xmlNewNsProp();
    test_ret += test_xmlNewNsPropEatName();
    test_ret += test_xmlNewPI();
    test_ret += test_xmlNewProp();
    test_ret += test_xmlNewReference();
    test_ret += test_xmlNewText();
    test_ret += test_xmlNewTextChild();
    test_ret += test_xmlNewTextLen();
    test_ret += test_xmlNextElementSibling();
    test_ret += test_xmlNodeAddContent();
    test_ret += test_xmlNodeAddContentLen();
    test_ret += test_xmlNodeBufGetContent();
    test_ret += test_xmlNodeDump();
    test_ret += test_xmlNodeDumpOutput();
    test_ret += test_xmlNodeGetBase();
    test_ret += test_xmlNodeGetContent();
    test_ret += test_xmlNodeGetLang();
    test_ret += test_xmlNodeGetSpacePreserve();
    test_ret += test_xmlNodeIsText();
    test_ret += test_xmlNodeListGetRawString();
    test_ret += test_xmlNodeListGetString();
    test_ret += test_xmlNodeSetBase();
    test_ret += test_xmlNodeSetContent();
    test_ret += test_xmlNodeSetContentLen();
    test_ret += test_xmlNodeSetLang();
    test_ret += test_xmlNodeSetName();
    test_ret += test_xmlNodeSetSpacePreserve();
    test_ret += test_xmlPreviousElementSibling();
    test_ret += test_xmlReconciliateNs();
    test_ret += test_xmlRemoveProp();
    test_ret += test_xmlReplaceNode();
    test_ret += test_xmlSaveFile();
    test_ret += test_xmlSaveFileEnc();
    test_ret += test_xmlSaveFileTo();
    test_ret += test_xmlSaveFormatFile();
    test_ret += test_xmlSaveFormatFileEnc();
    test_ret += test_xmlSaveFormatFileTo();
    test_ret += test_xmlSearchNs();
    test_ret += test_xmlSearchNsByHref();
    test_ret += test_xmlSetBufferAllocationScheme();
    test_ret += test_xmlSetCompressMode();
    test_ret += test_xmlSetDocCompressMode();
    test_ret += test_xmlSetNs();
    test_ret += test_xmlSetNsProp();
    test_ret += test_xmlSetProp();
    test_ret += test_xmlSplitQName2();
    test_ret += test_xmlSplitQName3();
    test_ret += test_xmlStringGetNodeList();
    test_ret += test_xmlStringLenGetNodeList();
    test_ret += test_xmlTextConcat();
    test_ret += test_xmlTextMerge();
    test_ret += test_xmlUnsetNsProp();
    test_ret += test_xmlUnsetProp();
    test_ret += test_xmlValidateNCName();
    test_ret += test_xmlValidateNMToken();
    test_ret += test_xmlValidateName();
    test_ret += test_xmlValidateQName();

    if (test_ret != 0)
	printf("Module tree: %d errors\n", test_ret);
    return(test_ret);
}